

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void __thiscall
duckdb::StringValueResult::AddValueToVector
          (StringValueResult *this,char *value_ptr,idx_t size,bool allocate)

{
  ParseTypeInfo *pPVar1;
  undefined8 *puVar2;
  char cVar3;
  PhysicalType PVar4;
  undefined4 uVar5;
  char *pcVar6;
  _Head_base<0UL,_duckdb::ParseTypeInfo_*,_false> _Var7;
  CSVReaderOptions *pCVar8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined2 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  bool bVar15;
  bool bVar16;
  DateCastResult DVar17;
  const_reference cVar18;
  byte bVar19;
  IntegerCastData<short> IVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  idx_t pos;
  CSVStateMachine *pCVar25;
  ulong uVar26;
  reference pvVar27;
  ostream *poVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  InvalidInputException *this_00;
  InternalException *pIVar32;
  undefined1 uVar33;
  timestamp_t *result;
  ulong uVar34;
  undefined8 uVar35;
  idx_t *piVar36;
  LogicalTypeId type;
  PhysicalType type_00;
  PhysicalType type_01;
  short sVar37;
  byte bVar38;
  idx_t i;
  byte *last;
  idx_t iVar39;
  ulong uVar40;
  long lVar41;
  byte *pbVar42;
  char cVar43;
  byte bVar44;
  ushort uVar45;
  undefined8 in_R8;
  ulong uVar46;
  uint uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  from_chars_result fVar51;
  anon_union_16_2_67f50693_for_value aVar52;
  string_t data;
  char local_280;
  ulong local_278;
  void *local_260;
  long local_258;
  ExponentData exponent;
  uint6 uStack_24e;
  char local_240 [16];
  idx_t *local_230;
  idx_t pos_1;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [23];
  idx_t *local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  IntegerCastData<short> simple_data;
  string local_70;
  string strip_thousands;
  
  bVar15 = HandleTooManyColumnsError(this,value_ptr,size);
  cVar43 = (char)in_R8;
  if (bVar15) {
    return;
  }
  local_230 = &this->cur_col_id;
  uVar49 = this->cur_col_id;
  if (this->number_of_columns <= uVar49) {
    pCVar25 = (this->super_ScannerResult).state_machine;
    if ((pCVar25->state_machine_options).strict_mode.value != true) {
      return;
    }
    if ((uVar49 == this->number_of_columns) &&
       (((this->super_ScannerResult).quoted != true ||
        (pCVar25->options->allow_quoted_nulls == true)))) {
      bVar15 = false;
      for (uVar49 = 0; uVar49 < this->null_str_count; uVar49 = uVar49 + 1) {
        bVar16 = true;
        if (bVar15 == false) {
          bVar16 = IsValueNull((this->null_str_ptr).
                               super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                               ._M_t.
                               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>
                               .super__Head_base<0UL,_const_char_**,_false>._M_head_impl[uVar49],
                               value_ptr,size);
        }
        bVar15 = bVar16;
      }
      if (bVar15 != false) {
        return;
      }
    }
    pos_1._0_1_ = 3;
    LineError::Insert(&this->current_errors,(CSVErrorType *)&pos_1,local_230,&this->chunk_col_id,
                      &(this->super_ScannerResult).last_position,0);
    this->cur_col_id = this->cur_col_id + 1;
    return;
  }
  if ((this->projecting_columns == true) &&
     ((this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar49] == false)) {
    *local_230 = uVar49 + 1;
    return;
  }
  bVar15 = (this->super_ScannerResult).quoted;
  pCVar25 = (this->super_ScannerResult).state_machine;
  if ((bVar15 != true) || (pCVar25->options->allow_quoted_nulls == true)) {
    if (((pCVar25->state_machine_options).strict_mode.value == false) &&
       ((this->super_ScannerResult).escaped == true)) {
      bVar38 = (bVar15 ^ 1U) & size == 1;
    }
    else {
      bVar38 = 0;
    }
    for (uVar49 = 0; cVar43 = (char)in_R8, uVar49 < this->null_str_count; uVar49 = uVar49 + 1) {
      iVar39 = (this->null_str_size).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[uVar49];
      if (iVar39 == 2) {
        pCVar25 = (this->super_ScannerResult).state_machine;
        pcVar6 = (this->null_str_ptr).
                 super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl[uVar49];
        if (*pcVar6 != (pCVar25->state_machine_options).escape.value) goto LAB_018a0a73;
        if ((bVar38 != 0) && (pcVar6[1] == *value_ptr)) goto LAB_018a0c09;
      }
      else {
LAB_018a0a73:
        if ((iVar39 == size && bVar38 == 0) &&
           (bVar15 = IsValueNull((this->null_str_ptr).
                                 super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>
                                 .super__Head_base<0UL,_const_char_**,_false>._M_head_impl[uVar49],
                                 value_ptr,size), bVar15)) {
          pCVar25 = (this->super_ScannerResult).state_machine;
LAB_018a0c09:
          piVar36 = &this->chunk_col_id;
          uVar49 = this->chunk_col_id;
          pCVar8 = pCVar25->options;
          if (uVar49 < (ulong)*(uint *)((long)&(pCVar8->force_not_null).
                                               super_vector<bool,_std::allocator<bool>_>.
                                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                                               super__Bvector_impl_data._M_finish.
                                               super__Bit_iterator_base + 8) +
                       ((long)(pCVar8->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                       (long)(pCVar8->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
            cVar18 = vector<bool,_true>::get<true>(&pCVar8->force_not_null,uVar49);
            uVar49 = *piVar36;
            if (cVar18) {
              if (*(LogicalTypeId *)
                   ((long)((this->parse_types).
                           super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                           .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl +
                          uVar49) + 1) == VARCHAR) {
                puVar2 = (undefined8 *)
                         ((long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar49] +
                         this->number_of_rows * 0x10);
                *puVar2 = 0;
                puVar2[1] = 0;
              }
              else {
                pos_1._0_1_ = 0;
                LineError::Insert(&this->current_errors,(CSVErrorType *)&pos_1,local_230,piVar36,
                                  &(this->super_ScannerResult).last_position,0);
              }
              goto LAB_018a145e;
            }
          }
          if (uVar49 == this->number_of_columns) {
            return;
          }
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(this->validity_mask).
                      super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
                      super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar49]->
                      super_TemplatedValidityMask<unsigned_long>,this->number_of_rows);
LAB_018a145e:
          *local_230 = *local_230 + 1;
          *piVar36 = *piVar36 + 1;
          return;
        }
      }
    }
  }
  strip_thousands._M_dataplus._M_p = (pointer)&strip_thousands.field_2;
  strip_thousands._M_string_length = 0;
  strip_thousands.field_2._M_local_buf[0] = '\0';
  bVar15 = LogicalType::IsNumeric
                     (*(LogicalTypeId *)
                       ((long)((this->parse_types).
                               super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl +
                              this->chunk_col_id) + 1));
  if ((bVar15) &&
     (cVar3 = ((this->super_ScannerResult).state_machine)->options->thousands_separator,
     cVar3 != '\0')) {
    BaseScanner::RemoveSeparator_abi_cxx11_
              ((string *)&pos_1,(BaseScanner *)value_ptr,(char *)size,(ulong)(uint)(int)cVar3,cVar43
              );
    ::std::__cxx11::string::operator=((string *)&strip_thousands,(string *)&pos_1);
    ::std::__cxx11::string::~string((string *)&pos_1);
    value_ptr = (char *)strip_thousands._M_dataplus;
    size = strip_thousands._M_string_length;
  }
  local_a8 = &this->chunk_col_id;
  _Var7._M_head_impl =
       (this->parse_types).
       super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>._M_t
       .super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
       .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
  iVar39 = this->chunk_col_id;
  pPVar1 = _Var7._M_head_impl + iVar39;
  switch(*(LogicalTypeId *)((long)(_Var7._M_head_impl + iVar39) + 1) - 10) {
  case 0:
    if (size - 1 < 5) {
      lVar41 = this->number_of_rows;
      pvVar9 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar39];
      switch(size) {
      case 1:
        uVar47 = tolower((int)*value_ptr);
        if ((char)uVar47 != '0') {
          uVar47 = uVar47 & 0xff;
          uVar33 = 1;
          if (uVar47 == 0x31) goto LAB_018a1762;
          if (uVar47 != 0x66) {
            if ((uVar47 == 0x79) || (uVar47 == 0x74)) goto LAB_018a1762;
            if (uVar47 != 0x6e) break;
          }
        }
LAB_018a1760:
        uVar33 = 0;
LAB_018a1762:
        *(undefined1 *)((long)pvVar9 + lVar41) = uVar33;
        goto LAB_018a1a7f;
      case 2:
        iVar22 = tolower((int)*value_ptr);
        uVar47 = tolower((int)(char)((byte *)value_ptr)[1]);
        if (((char)iVar22 == 'n') && ((uVar47 & 0xff) == 0x6f)) goto LAB_018a1760;
        break;
      case 3:
        iVar22 = tolower((int)*value_ptr);
        uVar47 = tolower((int)(char)((byte *)value_ptr)[1]);
        uVar21 = tolower((int)(char)((byte *)value_ptr)[2]);
        if ((((char)iVar22 == 'y') && ((uVar47 & 0xff) == 0x65)) &&
           (uVar33 = 1, (uVar21 & 0xff) == 0x73)) goto LAB_018a1762;
        break;
      case 4:
        iVar22 = tolower((int)*value_ptr);
        uVar47 = tolower((int)(char)((byte *)value_ptr)[1]);
        uVar21 = tolower((int)(char)((byte *)value_ptr)[2]);
        uVar23 = tolower((int)(char)((byte *)value_ptr)[3]);
        if ((((char)iVar22 == 't') && (((uVar47 & 0xff) == 0x72 && ((uVar21 & 0xff) == 0x75)))) &&
           (uVar33 = 1, (uVar23 & 0xff) == 0x65)) goto LAB_018a1762;
        break;
      case 5:
        iVar22 = tolower((int)*value_ptr);
        uVar47 = tolower((int)(char)((byte *)value_ptr)[1]);
        uVar21 = tolower((int)(char)((byte *)value_ptr)[2]);
        uVar23 = tolower((int)(char)((byte *)value_ptr)[3]);
        uVar24 = tolower((int)(char)((byte *)value_ptr)[4]);
        local_280 = (char)iVar22;
        if ((((local_280 == 'f') && ((uVar47 & 0xff) == 0x61)) && ((uVar21 & 0xff) == 0x6c)) &&
           (((uVar23 & 0xff) == 0x73 && ((uVar24 & 0xff) == 0x65)))) goto LAB_018a1760;
      }
    }
    break;
  case 1:
    local_258 = this->number_of_rows;
    local_260 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar39];
    for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
      bVar38 = ((byte *)value_ptr)[uVar49];
      if ((4 < bVar38 - 9) && (bVar38 != 0x20)) {
        if (bVar38 == 0x2d) {
          uVar26 = size - uVar49;
          bVar38 = 0;
          uVar34 = 1;
          goto LAB_018a0fb4;
        }
        if (bVar38 == 0x30 && size - 1 != uVar49) {
          bVar44 = ((byte *)value_ptr)[uVar49 + 1];
          if (bVar44 == 0x42) {
LAB_018a2fda:
            uVar34 = ~uVar49 + size;
            uVar40 = 1;
            bVar38 = 0;
            goto LAB_018a2fe3;
          }
          if (bVar44 != 0x78) {
            if (bVar44 == 0x62) goto LAB_018a2fda;
            if (bVar44 != 0x58) goto LAB_018a249f;
          }
          uVar34 = ~uVar49 + size;
          bVar38 = 0;
          uVar40 = 1;
          goto LAB_018a1d82;
        }
LAB_018a249f:
        uVar40 = (ulong)(bVar38 == 0x2b);
        bVar38 = 0;
        uVar26 = uVar40;
        goto LAB_018a24af;
      }
    }
    goto LAB_018a32f2;
  case 2:
    local_258 = this->number_of_rows;
    local_260 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar39];
    for (uVar49 = 0; iVar39 = size - uVar49, iVar39 != 0; uVar49 = uVar49 + 1) {
      bVar38 = ((byte *)value_ptr)[uVar49];
      if ((0x20 < (ulong)bVar38) || ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) == 0)) {
        simple_data.result = 0;
        if (bVar38 == 0x2d) {
          bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             ((char *)((byte *)value_ptr + uVar49),iVar39,&simple_data,false);
        }
        else {
          bVar15 = size - 1 == uVar49;
          if (bVar38 == 0x30 && !bVar15) {
            bVar38 = ((byte *)value_ptr)[uVar49 + 1];
            if (bVar38 == 0x42) {
LAB_018a440c:
              uVar26 = ~uVar49 + size;
              uVar34 = 1;
              goto LAB_018a4414;
            }
            if (bVar38 != 0x78) {
              if (bVar38 == 0x62) goto LAB_018a440c;
              if (bVar38 != 0x58) goto LAB_018a2bd8;
            }
            uVar26 = ~uVar49 + size;
            uVar34 = 1;
            goto LAB_018a2810;
          }
LAB_018a2bd8:
          bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             ((char *)((byte *)value_ptr + uVar49),iVar39,&simple_data,bVar15);
        }
        IVar20.result = simple_data.result;
        if (bVar15 != false) goto LAB_018a67ee;
        break;
      }
    }
    goto LAB_018a6417;
  case 3:
    local_258 = this->number_of_rows;
    local_260 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar39];
    for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
      bVar38 = ((byte *)value_ptr)[uVar49];
      if ((4 < bVar38 - 9) && (bVar38 != 0x20)) {
        if (bVar38 == 0x2d) {
          uVar26 = size - uVar49;
          uVar47 = 0;
          uVar34 = 1;
          goto LAB_018a10cb;
        }
        if (bVar38 == 0x30 && size - 1 != uVar49) {
          bVar44 = ((byte *)value_ptr)[uVar49 + 1];
          if (bVar44 == 0x42) {
LAB_018a3063:
            uVar34 = ~uVar49 + size;
            uVar40 = 1;
            uVar47 = 0;
            goto LAB_018a306f;
          }
          if (bVar44 != 0x78) {
            if (bVar44 == 0x62) goto LAB_018a3063;
            if (bVar44 != 0x58) goto LAB_018a2548;
          }
          uVar34 = ~uVar49 + size;
          uVar47 = 0;
          uVar40 = 1;
          goto LAB_018a1ebd;
        }
LAB_018a2548:
        uVar40 = (ulong)(bVar38 == 0x2b);
        uVar47 = 0;
        uVar26 = uVar40;
        goto LAB_018a2556;
      }
    }
    goto LAB_018a36f3;
  case 4:
    local_258 = this->number_of_rows;
    local_260 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar39];
    for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
      bVar38 = ((byte *)value_ptr)[uVar49];
      if ((4 < bVar38 - 9) && (bVar38 != 0x20)) {
        if (bVar38 == 0x2d) {
          uVar26 = size - uVar49;
          uVar40 = 0;
          uVar34 = 1;
          goto LAB_018a11b3;
        }
        if (bVar38 == 0x30 && size - 1 != uVar49) {
          bVar44 = ((byte *)value_ptr)[uVar49 + 1];
          if (bVar44 == 0x42) {
LAB_018a30ee:
            uVar34 = ~uVar49 + size;
            uVar40 = 0;
            uVar50 = 1;
            goto LAB_018a30fa;
          }
          if (bVar44 != 0x78) {
            if (bVar44 == 0x62) goto LAB_018a30ee;
            if (bVar44 != 0x58) goto LAB_018a25e3;
          }
          uVar34 = ~uVar49 + size;
          uVar40 = 0;
          uVar50 = 1;
          goto LAB_018a1ff5;
        }
LAB_018a25e3:
        uVar50 = (ulong)(bVar38 == 0x2b);
        uVar40 = 0;
        uVar26 = uVar50;
        goto LAB_018a25f5;
      }
    }
    goto LAB_018a3afe;
  case 5:
    bVar15 = StrTimeFormat::Empty(&(this->date_format).super_StrTimeFormat);
    if (!bVar15) {
      bVar15 = StrpTimeFormat::TryParseDate
                         (&this->date_format,value_ptr,size,
                          (date_t *)
                          (this->number_of_rows * 4 +
                          (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_start[this->chunk_col_id]));
      goto LAB_018a192b;
    }
    DVar17 = Date::TryConvertDate
                       (value_ptr,size,&pos_1,
                        (date_t *)
                        (this->number_of_rows * 4 +
                        (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start[this->chunk_col_id]),
                        (bool *)&exponent,false);
LAB_018a0e0a:
    if (DVar17 == SUCCESS) goto LAB_018a1a7f;
    break;
  case 6:
    bVar15 = Time::TryConvertTime
                       (value_ptr,size,&pos_1,
                        (dtime_t *)
                        (this->number_of_rows * 8 +
                        (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar39]),false,
                        (optional_ptr<int,_true>)0x0);
    goto LAB_018a192b;
  default:
    uVar35 = 10;
    uVar47 = (uint)size;
    if ((pPVar1->validate_utf8 != true) ||
       (bVar15 = Utf8Proc::IsValid(value_ptr,size & 0xffffffff), bVar15)) {
      uVar13 = uStack_220;
      uVar5 = pos_1._4_4_;
      pos_1._4_4_ = SUB84(value_ptr,0);
      uVar12 = pos_1._4_4_;
      uStack_220 = (undefined4)((ulong)value_ptr >> 0x20);
      uVar14 = uStack_220;
      if (!allocate) {
        if (uVar47 < 0xd) {
          uStack_220 = 0;
          pos_1._0_1_ = 0;
          pos_1._1_1_ = 0;
          pos_1._2_2_ = 0;
          pos_1._4_4_ = 0;
          if (uVar47 != 0) {
            switchD_016b45db::default(&pos_1,value_ptr,(ulong)(uVar47 & 0xf));
          }
        }
        else {
          uVar5 = *(undefined4 *)value_ptr;
          pos_1._0_1_ = (undefined1)uVar5;
          pos_1._1_1_ = (undefined1)((uint)uVar5 >> 8);
          pos_1._2_2_ = (undefined2)((uint)uVar5 >> 0x10);
        }
        pvVar9 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start[this->chunk_col_id];
        lVar41 = this->number_of_rows * 0x10;
        *(uint *)((long)pvVar9 + lVar41) = uVar47;
        *(ulong *)((long)pvVar9 + lVar41 + 4) =
             CONCAT44(pos_1._4_4_,CONCAT22(pos_1._2_2_,CONCAT11(pos_1._1_1_,(undefined1)pos_1)));
        *(undefined4 *)((long)pvVar9 + lVar41 + 0xc) = uStack_220;
        goto LAB_018a1a7f;
      }
      pos_1._4_4_ = uVar5;
      uStack_220 = uVar13;
      pvVar27 = vector<duckdb::Vector,_true>::get<true>
                          (&(this->parse_chunk).data,this->chunk_col_id);
      local_a0 = uVar47;
      if (uVar47 < 0xd) {
        uStack_94 = 0;
        uStack_9c = 0;
        uStack_98 = 0;
        if (uVar47 == 0) {
          value_ptr = (char *)0x0;
        }
        else {
          switchD_016b45db::default(&uStack_9c,value_ptr,(ulong)(uVar47 & 0xf));
          value_ptr = (char *)CONCAT44(uStack_94,uStack_98);
        }
      }
      else {
        uStack_9c = *(undefined4 *)value_ptr;
        uStack_98 = uVar12;
        uStack_94 = uVar14;
      }
      data.value.pointer.ptr = (char *)uVar35;
      data.value._0_8_ = value_ptr;
      aVar52.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob
                     ((StringVector *)pvVar27,(Vector *)CONCAT44(uStack_9c,local_a0),data);
    }
    else {
      if (((((this->super_ScannerResult).state_machine)->options->ignore_errors).value == false) &&
         ((this->sniffing & 1U) != 0)) {
        HandleUnicodeError(this,this->cur_col_id,&(this->super_ScannerResult).last_position);
      }
      pos_1._0_1_ = 8;
      piVar36 = local_a8;
      LineError::Insert(&this->current_errors,(CSVErrorType *)&pos_1,local_230,local_a8,
                        &(this->super_ScannerResult).last_position,0);
      pvVar27 = vector<duckdb::Vector,_true>::get<true>
                          (&(this->parse_chunk).data,this->chunk_col_id);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = piVar36;
      aVar52.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob
                     ((StringVector *)pvVar27,(Vector *)0x0,(string_t)(auVar10 << 0x40));
    }
    pvVar9 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
             _M_start[this->chunk_col_id];
    lVar41 = this->number_of_rows * 0x10;
    *(long *)((long)pvVar9 + lVar41) = aVar52._0_8_;
    *(char **)((long)pvVar9 + lVar41 + 8) = aVar52.pointer.ptr;
    goto LAB_018a1a7f;
  case 9:
  case 0x16:
    bVar15 = StrTimeFormat::Empty(&(this->timestamp_format).super_StrTimeFormat);
    result = (timestamp_t *)
             (this->number_of_rows * 8 +
             (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start[this->chunk_col_id]);
    if (bVar15) {
      DVar17 = Timestamp::TryConvertTimestamp
                         (value_ptr,size,result,(optional_ptr<int,_true>)0x0,false);
      goto LAB_018a0e0a;
    }
    bVar15 = StrpTimeFormat::TryParseTimestamp(&this->timestamp_format,value_ptr,size,result);
    goto LAB_018a192b;
  case 0xb:
    if (this->decimal_separator == '.') {
      PVar4 = pPVar1->internal_type;
      if (PVar4 == INT128) {
        bVar15 = TryDecimalStringCast<duckdb::hugeint_t,(char)46>
                           (value_ptr,size,
                            (hugeint_t *)
                            (this->number_of_rows * 0x10 +
                            (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar39]),pPVar1->width,
                            pPVar1->scale);
      }
      else if (PVar4 == INT32) {
        bVar15 = TryDecimalStringCast<int,(char)46>
                           (value_ptr,size,
                            (int *)(this->number_of_rows * 4 +
                                   (long)(this->vector_ptr).
                                         super_vector<void_*,_std::allocator<void_*>_>.
                                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                         .super__Vector_impl_data._M_start[iVar39]),pPVar1->width,
                            pPVar1->scale);
      }
      else if (PVar4 == INT64) {
        bVar15 = TryDecimalStringCast<long,(char)46>
                           (value_ptr,size,
                            (long *)(this->number_of_rows * 8 +
                                    (long)(this->vector_ptr).
                                          super_vector<void_*,_std::allocator<void_*>_>.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start[iVar39]),
                            pPVar1->width,pPVar1->scale);
      }
      else {
        if (PVar4 != INT16) {
          pIVar32 = (InternalException *)__cxa_allocate_exception(0x10);
          TypeIdToString_abi_cxx11_
                    ((string *)&exponent,
                     (duckdb *)
                     (ulong)*(PhysicalType *)
                             ((long)((this->parse_types).
                                     super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                     .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>.
                                     _M_head_impl + this->chunk_col_id) + 2),type_01);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &pos_1,"Invalid Physical Type for Decimal Value. Physical Type: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &exponent);
          InternalException::InternalException(pIVar32,(string *)&pos_1);
          __cxa_throw(pIVar32,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar15 = TryDecimalStringCast<short,(char)46>
                           (value_ptr,size,
                            (short *)(this->number_of_rows * 2 +
                                     (long)(this->vector_ptr).
                                           super_vector<void_*,_std::allocator<void_*>_>.
                                           super__Vector_base<void_*,_std::allocator<void_*>_>.
                                           _M_impl.super__Vector_impl_data._M_start[iVar39]),
                            pPVar1->width,pPVar1->scale);
      }
    }
    else {
      if (this->decimal_separator != ',') {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&pos_1,"Decimals can only have \',\' and \'.\' as decimal separators",
                   (allocator *)&exponent);
        InvalidInputException::InvalidInputException(this_00,(string *)&pos_1);
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      PVar4 = pPVar1->internal_type;
      if (PVar4 == INT128) {
        bVar15 = TryDecimalStringCast<duckdb::hugeint_t,(char)44>
                           (value_ptr,size,
                            (hugeint_t *)
                            (this->number_of_rows * 0x10 +
                            (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar39]),pPVar1->width,
                            pPVar1->scale);
      }
      else if (PVar4 == INT32) {
        bVar15 = TryDecimalStringCast<int,(char)44>
                           (value_ptr,size,
                            (int *)(this->number_of_rows * 4 +
                                   (long)(this->vector_ptr).
                                         super_vector<void_*,_std::allocator<void_*>_>.
                                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                         .super__Vector_impl_data._M_start[iVar39]),pPVar1->width,
                            pPVar1->scale);
      }
      else if (PVar4 == INT64) {
        bVar15 = TryDecimalStringCast<long,(char)44>
                           (value_ptr,size,
                            (long *)(this->number_of_rows * 8 +
                                    (long)(this->vector_ptr).
                                          super_vector<void_*,_std::allocator<void_*>_>.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start[iVar39]),
                            pPVar1->width,pPVar1->scale);
      }
      else {
        if (PVar4 != INT16) {
          pIVar32 = (InternalException *)__cxa_allocate_exception(0x10);
          TypeIdToString_abi_cxx11_
                    ((string *)&exponent,
                     (duckdb *)
                     (ulong)*(PhysicalType *)
                             ((long)((this->parse_types).
                                     super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                     .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>.
                                     _M_head_impl + this->chunk_col_id) + 2),type_00);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &pos_1,"Invalid Physical Type for Decimal Value. Physical Type: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &exponent);
          InternalException::InternalException(pIVar32,(string *)&pos_1);
          __cxa_throw(pIVar32,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar15 = TryDecimalStringCast<short,(char)44>
                           (value_ptr,size,
                            (short *)(this->number_of_rows * 2 +
                                     (long)(this->vector_ptr).
                                           super_vector<void_*,_std::allocator<void_*>_>.
                                           super__Vector_base<void_*,_std::allocator<void_*>_>.
                                           _M_impl.super__Vector_impl_data._M_start[iVar39]),
                            pPVar1->width,pPVar1->scale);
      }
    }
LAB_018a192b:
    if (bVar15 != false) goto LAB_018a1a7f;
    break;
  case 0xc:
    pbVar42 = (byte *)value_ptr;
    uVar49 = size;
    while (uVar49 != 0) {
      bVar38 = *pbVar42;
      if ((0x20 < (ulong)bVar38) || ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) == 0)) {
        last = pbVar42 + uVar49;
        fVar51 = duckdb_fast_float::from_chars<float>
                           ((char *)(pbVar42 + (bVar38 == 0x2b)),(char *)last,
                            (float *)(this->number_of_rows * 4 +
                                     (long)(this->vector_ptr).
                                           super_vector<void_*,_std::allocator<void_*>_>.
                                           super__Vector_base<void_*,_std::allocator<void_*>_>.
                                           _M_impl.super__Vector_impl_data._M_start[iVar39]),false,
                            *(((this->super_ScannerResult).state_machine)->options->
                             decimal_separator)._M_dataplus._M_p,general);
        pbVar42 = (byte *)fVar51.ptr;
        if (fVar51.ec == 0) goto LAB_018a17b2;
        break;
      }
      pbVar42 = pbVar42 + 1;
      uVar49 = uVar49 - 1;
    }
    break;
  case 0xd:
    pbVar42 = (byte *)value_ptr;
    uVar49 = size;
    while (uVar49 != 0) {
      bVar38 = *pbVar42;
      if ((0x20 < (ulong)bVar38) || ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) == 0)) {
        last = pbVar42 + uVar49;
        fVar51 = duckdb_fast_float::from_chars<double>
                           ((char *)(pbVar42 + (bVar38 == 0x2b)),(char *)last,
                            (double *)
                            (this->number_of_rows * 8 +
                            (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar39]),false,
                            *(((this->super_ScannerResult).state_machine)->options->
                             decimal_separator)._M_dataplus._M_p,general);
        pbVar42 = (byte *)fVar51.ptr;
        if (fVar51.ec == 0) goto LAB_018a181e;
        break;
      }
      pbVar42 = pbVar42 + 1;
      uVar49 = uVar49 - 1;
    }
    break;
  case 0x12:
    local_258 = this->number_of_rows;
    local_260 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar39];
    for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
      bVar38 = ((byte *)value_ptr)[uVar49];
      if ((4 < bVar38 - 9) && (bVar38 != 0x20)) {
        if (bVar38 == 0x2d) {
          uVar26 = size - uVar49;
          uVar34 = 1;
          goto LAB_018a0e69;
        }
        if (bVar38 == 0x30 && size - 1 != uVar49) {
          bVar44 = ((byte *)value_ptr)[uVar49 + 1];
          if (bVar44 == 0x42) {
LAB_018a2f52:
            uVar34 = ~uVar49 + size;
            uVar40 = 1;
            bVar38 = 0;
            goto LAB_018a2f5b;
          }
          if (bVar44 != 0x78) {
            if (bVar44 == 0x62) goto LAB_018a2f52;
            if (bVar44 != 0x58) goto LAB_018a23f6;
          }
          uVar34 = ~uVar49 + size;
          bVar38 = 0;
          uVar40 = 1;
          goto LAB_018a1c4b;
        }
LAB_018a23f6:
        uVar40 = (ulong)(bVar38 == 0x2b);
        bVar38 = 0;
        uVar26 = uVar40;
        goto LAB_018a2406;
      }
    }
    goto LAB_018a57a8;
  case 0x13:
    local_258 = this->number_of_rows;
    local_260 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar39];
    for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
      bVar38 = ((byte *)value_ptr)[uVar49];
      if ((4 < bVar38 - 9) && (bVar38 != 0x20)) {
        if (bVar38 == 0x2d) {
          uVar26 = size - uVar49;
          uVar34 = 1;
          goto LAB_018a0cfe;
        }
        if (bVar38 == 0x30 && size - 1 != uVar49) {
          bVar44 = ((byte *)value_ptr)[uVar49 + 1];
          if (bVar44 == 0x42) {
LAB_018a2ec9:
            uVar34 = ~uVar49 + size;
            uVar40 = 1;
            uVar45 = 0;
            goto LAB_018a2ed2;
          }
          if (bVar44 != 0x78) {
            if (bVar44 == 0x62) goto LAB_018a2ec9;
            if (bVar44 != 0x58) goto LAB_018a2352;
          }
          uVar34 = ~uVar49 + size;
          uVar45 = 0;
          uVar40 = 1;
          goto LAB_018a1b04;
        }
LAB_018a2352:
        uVar40 = (ulong)(bVar38 == 0x2b);
        uVar45 = 0;
        uVar26 = uVar40;
        goto LAB_018a2365;
      }
    }
    goto LAB_018a51ac;
  case 0x14:
    local_258 = this->number_of_rows;
    local_260 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar39];
    for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
      bVar38 = ((byte *)value_ptr)[uVar49];
      if ((4 < bVar38 - 9) && (bVar38 != 0x20)) {
        if (bVar38 == 0x2d) {
          uVar26 = size - uVar49;
          uVar34 = 1;
          goto LAB_018a12a1;
        }
        if (bVar38 == 0x30 && size - 1 != uVar49) {
          bVar44 = ((byte *)value_ptr)[uVar49 + 1];
          if (bVar44 == 0x42) {
LAB_018a3185:
            uVar34 = ~uVar49 + size;
            uVar40 = 1;
            uVar47 = 0;
            goto LAB_018a318e;
          }
          if (bVar44 != 0x78) {
            if (bVar44 == 0x62) goto LAB_018a3185;
            if (bVar44 != 0x58) goto LAB_018a268b;
          }
          uVar34 = ~uVar49 + size;
          uVar47 = 0;
          uVar40 = 1;
          goto LAB_018a2135;
        }
LAB_018a268b:
        uVar40 = (ulong)(bVar38 == 0x2b);
        uVar47 = 0;
        uVar26 = uVar40;
        goto LAB_018a2699;
      }
    }
    goto LAB_018a5dcf;
  case 0x15:
    local_258 = this->number_of_rows;
    local_260 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar39];
    for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
      bVar38 = ((byte *)value_ptr)[uVar49];
      if ((4 < bVar38 - 9) && (bVar38 != 0x20)) {
        if (bVar38 == 0x2d) {
          uVar26 = size - uVar49;
          uVar34 = 1;
          goto LAB_018a1313;
        }
        if (bVar38 == 0x30 && size - 1 != uVar49) {
          bVar44 = ((byte *)value_ptr)[uVar49 + 1];
          if (bVar44 == 0x42) {
LAB_018a3209:
            uVar34 = ~uVar49 + size;
            uVar40 = 0;
            uVar50 = 1;
            goto LAB_018a3215;
          }
          if (bVar44 != 0x78) {
            if (bVar44 == 0x62) goto LAB_018a3209;
            if (bVar44 != 0x58) goto LAB_018a2723;
          }
          uVar34 = ~uVar49 + size;
          uVar40 = 0;
          uVar50 = 1;
          goto LAB_018a2265;
        }
LAB_018a2723:
        uVar50 = (ulong)(bVar38 == 0x2b);
        uVar40 = 0;
        uVar26 = uVar50;
        goto LAB_018a2735;
      }
    }
    goto LAB_018a48f3;
  }
  goto LAB_018a1933;
  while (lVar41 = uVar49 + uVar34, uVar34 = uVar34 + 1, ((byte *)value_ptr)[lVar41] == 0x30) {
LAB_018a1313:
    if (uVar26 <= uVar34) {
      uVar40 = 0;
      uVar34 = 1;
      goto LAB_018a2abf;
    }
  }
LAB_018a48f3:
  for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
    bVar38 = ((byte *)value_ptr)[uVar49];
    if ((0x20 < (ulong)bVar38) || ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) == 0)) {
      local_218[0]._M_allocated_capacity = 0;
      pos_1._0_1_ = 0;
      pos_1._1_1_ = 0;
      uVar33 = pos_1._1_1_;
      pos_1._2_2_ = 0;
      uVar11 = pos_1._2_2_;
      pos_1._4_4_ = 0;
      uVar5 = pos_1._4_4_;
      uStack_220 = 0;
      uVar12 = uStack_220;
      uStack_21c = 0;
      uVar13 = uStack_21c;
      uVar26 = ~uVar49;
      bVar15 = SUB81(uVar34,0);
      if (bVar38 == 0x2d) {
        uVar40 = 1;
        goto LAB_018a4941;
      }
      if (bVar38 == 0x30 && size - 1 != uVar49) {
        bVar44 = ((byte *)value_ptr)[uVar49 + 1];
        if (bVar44 == 0x42) {
LAB_018a4d66:
          lVar41 = 0;
          uVar34 = 1;
          goto LAB_018a4d73;
        }
        if (bVar44 != 0x78) {
          if (bVar44 == 0x62) goto LAB_018a4d66;
          if (bVar44 != 0x58) goto LAB_018a4a84;
        }
        uVar40 = 0;
        uVar34 = 1;
        goto LAB_018a49a7;
      }
LAB_018a4a84:
      local_278 = (ulong)(bVar38 == 0x2b);
      uVar50 = 0;
      uVar40 = local_278;
      goto LAB_018a4a99;
    }
  }
  goto LAB_018a1933;
LAB_018a2abf:
  uVar50 = uVar34;
  if (uVar26 <= uVar50) goto joined_r0x018a63f4;
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
  if (9 < (byte)(bVar38 - 0x30)) {
    if (bVar38 == 0x2e) {
      if (uVar26 <= uVar50 + 1) goto joined_r0x018a63f4;
      if ((uVar50 < 2) ||
         (bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar50], uVar50 = uVar50 + 1,
         (byte)(bVar38 - 0x30) < 10)) goto LAB_018a48f3;
    }
    if ((bVar38 < 0x21) && ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) {
      uVar34 = uVar50 + 1;
      uVar50 = uVar34;
      if (uVar34 < uVar26) {
        uVar50 = uVar26;
      }
      goto LAB_018a48ca;
    }
    goto LAB_018a48f3;
  }
  uVar40 = uVar40 * 10 - (ulong)(byte)(bVar38 - 0x30);
  uVar34 = uVar26;
  if (((~uVar50 + size != uVar49) &&
      (uVar34 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
     (((size - uVar50) - 2 == uVar49 ||
      (uVar34 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))
  goto LAB_018a48f3;
  goto LAB_018a2abf;
LAB_018a48ca:
  if (uVar26 <= uVar34) goto joined_r0x018a63f4;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar34]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar34] & 0x3f) & 1) == 0))
  goto LAB_018a48f3;
  uVar34 = uVar34 + 1;
  goto LAB_018a48ca;
LAB_018a3215:
  if (uVar34 <= uVar50) goto joined_r0x018a63f4;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x30) {
    uVar26 = 0;
  }
  else {
    uVar26 = 1;
    if (((byte *)value_ptr)[uVar49 + 1 + uVar50] != 0x31) goto LAB_018a48f3;
  }
  uVar29 = uVar34;
  if ((size - uVar50) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar50] == 0x5f) {
      if (((size - uVar50) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar50] & 0xfe) != 0x30)) goto LAB_018a48f3;
      uVar29 = uVar50 + 2;
    }
    else {
      uVar29 = uVar50 + 1;
    }
  }
  uVar50 = uVar29;
  if ((long)uVar40 < 0) goto LAB_018a48f3;
  uVar40 = uVar26 + uVar40 * 2;
  goto LAB_018a3215;
LAB_018a2265:
  if (uVar34 <= uVar50) goto joined_r0x018a63f4;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar50];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a48f3;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar26 = uVar34;
  if ((size - uVar50) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar50] == 0x5f) {
      if (((size - uVar50) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar50]), !bVar15))
      goto LAB_018a48f3;
      uVar26 = uVar50 + 2;
    }
    else {
      uVar26 = uVar50 + 1;
    }
  }
  if (~(ulong)(byte)(cVar43 + bVar44) >> 4 < uVar40) goto LAB_018a48f3;
  uVar40 = uVar40 * 0x10 + (ulong)(byte)(cVar43 + bVar44);
  uVar50 = uVar26;
  goto LAB_018a2265;
joined_r0x018a63f4:
  if (1 < uVar50) goto LAB_018a63fa;
  goto LAB_018a48f3;
LAB_018a2735:
  uVar29 = uVar26;
  if (uVar34 <= uVar29) goto LAB_018a2c63;
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar29];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    if (bVar38 == 0x2e) {
      uVar26 = uVar29 + 1;
      if (uVar34 <= uVar26) {
        bVar15 = uVar50 < uVar29;
        uVar29 = uVar26;
        if (bVar15) goto LAB_018a2c63;
        goto LAB_018a48f3;
      }
      if ((uVar29 <= uVar50) ||
         (bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar29], uVar29 = uVar26,
         (byte)(bVar38 - 0x30) < 10)) goto LAB_018a48f3;
    }
    if ((bVar38 < 0x21) && ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) {
      uVar26 = uVar29 + 1;
      uVar29 = uVar26;
      if (uVar26 < uVar34) {
        uVar29 = uVar34;
      }
      goto LAB_018a43e1;
    }
    goto LAB_018a48f3;
  }
  if ((~(ulong)bVar44 / 10 < uVar40) ||
     (((uVar40 = uVar40 * 10 + (ulong)bVar44, uVar26 = uVar34, ~uVar29 + size != uVar49 &&
       (uVar26 = uVar29 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar29] == 0x5f)) &&
      (((size - uVar29) - 2 == uVar49 ||
       (uVar26 = uVar29 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar29] - 0x30)))))))
  goto LAB_018a48f3;
  goto LAB_018a2735;
LAB_018a43e1:
  if (uVar34 <= uVar26) goto LAB_018a2c63;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
  goto LAB_018a48f3;
  uVar26 = uVar26 + 1;
  goto LAB_018a43e1;
LAB_018a2c63:
  if (uVar50 < uVar29) goto LAB_018a63fa;
  goto LAB_018a48f3;
  while (lVar41 = uVar49 + uVar40, uVar40 = uVar40 + 1, ((byte *)value_ptr)[lVar41] == 0x30) {
LAB_018a4941:
    if (uVar34 <= uVar40) {
      lVar41 = 0;
      uVar40 = 1;
      goto LAB_018a4b2b;
    }
  }
  goto LAB_018a1933;
  while( true ) {
    bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
    if (9 < (byte)(bVar38 - 0x30)) {
      if (bVar38 != 0x2e) goto LAB_018a510e;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar46 = 0;
      uVar31 = uVar29;
      goto LAB_018a4cce;
    }
    lVar41 = lVar41 * 10 - (ulong)(byte)(bVar38 - 0x30);
    uVar40 = uVar34;
    if (((~uVar50 + size != uVar49) &&
        (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
       ((pos_1._1_1_ = uVar33, pos_1._2_2_ = uVar11, pos_1._4_4_ = uVar5,
        (size - uVar50) - 2 == uVar49 ||
        (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30))))) break;
LAB_018a4b2b:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a4c7c;
  }
  goto LAB_018a1933;
LAB_018a4cce:
  uVar40 = uVar31;
  uStack_220 = (undefined4)uVar46;
  uStack_21c = (undefined4)(uVar46 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a4c7c;
    goto LAB_018a1933;
  }
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a510e;
    goto LAB_018a1933;
  }
  uVar30 = ~(ulong)bVar44 / 10;
  bVar16 = uVar46 <= uVar30;
  uVar31 = uVar46 * 10 + (ulong)bVar44;
  if (uVar30 < uVar46) {
    uVar31 = uVar46;
  }
  uVar46 = uVar31;
  uVar45 = uVar45 + bVar16;
  uVar31 = uVar34;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a4cce;
LAB_018a510e:
  if (bVar38 - 9 < 5) {
LAB_018a511e:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a4c7c:
    bVar15 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,true>
                       ((IntegerDecimalCastData<unsigned_long> *)&pos_1);
    goto LAB_018a4c86;
  }
  if ((bVar38 == 0x65) || (bVar38 == 0x45)) {
    if ((uVar40 != 1) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<unsigned_long>,true>
                           ((IntegerDecimalCastData<unsigned_long> *)&pos_1,exponent.result);
        goto joined_r0x018a6b2e;
      }
    }
  }
  else if (bVar38 == 0x20) goto LAB_018a511e;
  goto LAB_018a1933;
LAB_018a4d73:
  if (uVar26 + size <= uVar34) goto LAB_018a5159;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar34] == 0x30) {
    uVar40 = 0;
  }
  else {
    uVar40 = 1;
    if (((byte *)value_ptr)[uVar49 + 1 + uVar34] != 0x31) goto LAB_018a1933;
  }
  uVar50 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar34] & 0xfe) != 0x30)) goto LAB_018a1933;
      uVar50 = uVar34 + 2;
    }
    else {
      uVar50 = uVar34 + 1;
    }
  }
  uVar34 = uVar50;
  if (lVar41 < 0) goto LAB_018a1933;
  lVar41 = uVar40 + lVar41 * 2;
  goto LAB_018a4d73;
LAB_018a5159:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                     ((IntegerDecimalCastData<unsigned_long> *)&pos_1);
  goto LAB_018a6b29;
LAB_018a49a7:
  if (uVar26 + size <= uVar34) goto LAB_018a6a6b;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar34];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a1933;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar50 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar34]), !bVar15))
      goto LAB_018a1933;
      uVar50 = uVar34 + 2;
    }
    else {
      uVar50 = uVar34 + 1;
    }
  }
  if (~(ulong)(byte)(cVar43 + bVar44) >> 4 < uVar40) goto LAB_018a1933;
  uVar40 = uVar40 * 0x10 + (ulong)(byte)(cVar43 + bVar44);
  uVar34 = uVar50;
  goto LAB_018a49a7;
LAB_018a6a6b:
  pos_1._0_1_ = (undefined1)uVar40;
  pos_1._1_1_ = (undefined1)(uVar40 >> 8);
  pos_1._2_2_ = (undefined2)(uVar40 >> 0x10);
  pos_1._4_4_ = (undefined4)(uVar40 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                     ((IntegerDecimalCastData<unsigned_long> *)&pos_1);
  goto LAB_018a6b29;
  while( true ) {
    bVar38 = ((byte *)value_ptr)[uVar49 + uVar29];
    bVar44 = bVar38 - 0x30;
    if (9 < bVar44) {
      if (bVar38 != 0x2e) goto LAB_018a4eeb;
      uVar50 = uVar29 + 1;
      uVar45 = 0;
      uVar46 = 0;
      uVar31 = uVar50;
      goto LAB_018a4bdc;
    }
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if ((~(ulong)bVar44 / 10 < uVar50) ||
       (((uVar50 = uVar50 * 10 + (ulong)bVar44, uVar40 = uVar34, ~uVar29 + size != uVar49 &&
         (uVar40 = uVar29 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar29] == 0x5f)) &&
        (((size - uVar29) - 2 == uVar49 ||
         (uVar40 = uVar29 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar29] - 0x30)))))))
    break;
LAB_018a4a99:
    uVar29 = uVar40;
    pos_1._2_2_ = (undefined2)(uVar50 >> 0x10);
    pos_1._0_1_ = (undefined1)uVar50;
    pos_1._1_1_ = (undefined1)(uVar50 >> 8);
    pos_1._4_4_ = (undefined4)(uVar50 >> 0x20);
    uVar40 = uVar29;
    if (uVar34 <= uVar29) goto LAB_018a4ba8;
  }
  goto LAB_018a1933;
LAB_018a4bdc:
  uVar40 = uVar31;
  uStack_220 = (undefined4)uVar46;
  uStack_21c = (undefined4)(uVar46 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar29) || (uVar50 < uVar40)) goto LAB_018a4ba8;
    goto LAB_018a1933;
  }
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar29) || (uVar50 < uVar40)) goto LAB_018a4eeb;
    goto LAB_018a1933;
  }
  uVar30 = ~(ulong)bVar44 / 10;
  bVar16 = uVar46 <= uVar30;
  uVar31 = uVar46 * 10 + (ulong)bVar44;
  if (uVar30 < uVar46) {
    uVar31 = uVar46;
  }
  uVar46 = uVar31;
  uVar45 = uVar45 + bVar16;
  uVar31 = uVar34;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a4bdc;
LAB_018a4eeb:
  uVar47 = (uint)bVar38;
  if (uVar47 - 9 < 5) {
LAB_018a4efa:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a4ba8:
    bVar15 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                       ((IntegerDecimalCastData<unsigned_long> *)&pos_1);
    goto LAB_018a4bb2;
  }
  if ((uVar47 == 0x65) || (uVar47 == 0x45)) {
    if ((uVar40 != local_278) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                           ((IntegerDecimalCastData<unsigned_long> *)&pos_1,exponent.result);
        goto joined_r0x018a6b2e;
      }
    }
  }
  else if (uVar47 == 0x20) goto LAB_018a4efa;
  goto LAB_018a1933;
  while (lVar41 = uVar49 + uVar34, uVar34 = uVar34 + 1, ((byte *)value_ptr)[lVar41] == 0x30) {
LAB_018a12a1:
    if (uVar26 <= uVar34) {
      uVar47 = 0;
      uVar34 = 1;
      goto LAB_018a2a44;
    }
  }
LAB_018a5dcf:
  for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
    bVar38 = ((byte *)value_ptr)[uVar49];
    if ((0x20 < (ulong)bVar38) || ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) == 0)) {
      local_218[0]._M_allocated_capacity = 0;
      pos_1._0_1_ = 0;
      pos_1._1_1_ = 0;
      uVar33 = pos_1._1_1_;
      pos_1._2_2_ = 0;
      uVar11 = pos_1._2_2_;
      pos_1._4_4_ = 0;
      uVar5 = pos_1._4_4_;
      uStack_220 = 0;
      uVar12 = uStack_220;
      uStack_21c = 0;
      uVar13 = uStack_21c;
      uVar26 = ~uVar49;
      bVar15 = SUB81(uVar34,0);
      if (bVar38 == 0x2d) {
        uVar40 = 1;
        goto LAB_018a5e3a;
      }
      if (bVar38 == 0x30 && size - 1 != uVar49) {
        bVar44 = ((byte *)value_ptr)[uVar49 + 1];
        if (bVar44 == 0x42) {
LAB_018a62ae:
          lVar41 = 0;
          uVar34 = 1;
          goto LAB_018a62bb;
        }
        if (bVar44 != 0x78) {
          if (bVar44 == 0x62) goto LAB_018a62ae;
          if (bVar44 != 0x58) goto LAB_018a5f85;
        }
        lVar41 = 0;
        uVar34 = 1;
        goto LAB_018a5ea0;
      }
LAB_018a5f85:
      local_278 = (ulong)(bVar38 == 0x2b);
      lVar41 = 0;
      uVar40 = local_278;
      goto LAB_018a5f9a;
    }
  }
  goto LAB_018a1933;
LAB_018a2a44:
  uVar40 = uVar34;
  if (uVar26 <= uVar40) goto joined_r0x018a5dcd;
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  if (9 < (byte)(bVar38 - 0x30)) {
    if (bVar38 == 0x2e) {
      if (uVar26 <= uVar40 + 1) goto joined_r0x018a5dcd;
      if ((uVar40 < 2) ||
         (bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar40], uVar40 = uVar40 + 1,
         (byte)(bVar38 - 0x30) < 10)) goto LAB_018a5dcf;
    }
    if ((bVar38 < 0x21) && ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) {
      uVar34 = uVar40 + 1;
      uVar40 = uVar34;
      if (uVar34 < uVar26) {
        uVar40 = uVar26;
      }
      goto LAB_018a4860;
    }
    goto LAB_018a5dcf;
  }
  uVar47 = uVar47 * 10 - (uint)(byte)(bVar38 - 0x30);
  uVar34 = uVar26;
  if (((~uVar40 + size != uVar49) &&
      (uVar34 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     (((size - uVar40) - 2 == uVar49 ||
      (uVar34 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a5dcf;
  goto LAB_018a2a44;
LAB_018a4860:
  if (uVar26 <= uVar34) goto joined_r0x018a5dcd;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar34]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar34] & 0x3f) & 1) == 0))
  goto LAB_018a5dcf;
  uVar34 = uVar34 + 1;
  goto LAB_018a4860;
LAB_018a318e:
  if (uVar34 <= uVar40) goto joined_r0x018a5dcd;
  iVar22 = 0;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar40] != 0x30) {
    if (((byte *)value_ptr)[uVar49 + 1 + uVar40] != 0x31) goto LAB_018a5dcf;
    iVar22 = 1;
  }
  uVar26 = uVar34;
  if ((size - uVar40) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar40] == 0x5f) {
      if (((size - uVar40) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar40] & 0xfe) != 0x30)) goto LAB_018a5dcf;
      uVar26 = uVar40 + 2;
    }
    else {
      uVar26 = uVar40 + 1;
    }
  }
  uVar40 = uVar26;
  if ((int)uVar47 < 0) goto LAB_018a5dcf;
  uVar47 = iVar22 + uVar47 * 2;
  goto LAB_018a318e;
LAB_018a2135:
  if (uVar34 <= uVar40) goto joined_r0x018a5dcd;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar40];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a5dcf;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar26 = uVar34;
  if ((size - uVar40) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar40] == 0x5f) {
      if (((size - uVar40) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar40]), !bVar15))
      goto LAB_018a5dcf;
      uVar26 = uVar40 + 2;
    }
    else {
      uVar26 = uVar40 + 1;
    }
  }
  if (~(uint)(byte)(cVar43 + bVar44) >> 4 < uVar47) goto LAB_018a5dcf;
  uVar47 = uVar47 * 0x10 + (uint)(byte)(cVar43 + bVar44);
  uVar40 = uVar26;
  goto LAB_018a2135;
joined_r0x018a5dcd:
  if (1 < uVar40) goto LAB_018a5e07;
  goto LAB_018a5dcf;
LAB_018a2699:
  uVar50 = uVar26;
  if (uVar34 <= uVar50) goto LAB_018a2c52;
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    if (bVar38 == 0x2e) {
      uVar26 = uVar50 + 1;
      if (uVar34 <= uVar26) {
        bVar15 = uVar40 < uVar50;
        uVar50 = uVar26;
        if (bVar15) goto LAB_018a2c52;
        goto LAB_018a5dcf;
      }
      if ((uVar50 <= uVar40) ||
         (bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar50], uVar50 = uVar26,
         (byte)(bVar38 - 0x30) < 10)) goto LAB_018a5dcf;
    }
    if ((bVar38 < 0x21) && ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) {
      uVar26 = uVar50 + 1;
      uVar50 = uVar26;
      if (uVar26 < uVar34) {
        uVar50 = uVar34;
      }
      goto LAB_018a4379;
    }
    goto LAB_018a5dcf;
  }
  if ((~(uint)bVar44 / 10 < uVar47) ||
     (((uVar47 = uVar47 * 10 + (uint)bVar44, uVar26 = uVar34, ~uVar50 + size != uVar49 &&
       (uVar26 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
      (((size - uVar50) - 2 == uVar49 ||
       (uVar26 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
  goto LAB_018a5dcf;
  goto LAB_018a2699;
LAB_018a4379:
  if (uVar34 <= uVar26) goto LAB_018a2c52;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
  goto LAB_018a5dcf;
  uVar26 = uVar26 + 1;
  goto LAB_018a4379;
LAB_018a2c52:
  if (uVar40 < uVar50) goto LAB_018a5e07;
  goto LAB_018a5dcf;
  while (lVar41 = uVar49 + uVar40, uVar40 = uVar40 + 1, ((byte *)value_ptr)[lVar41] == 0x30) {
LAB_018a5e3a:
    if (uVar34 <= uVar40) {
      lVar41 = 0;
      uVar40 = 1;
      goto LAB_018a6044;
    }
  }
  goto LAB_018a1933;
  while( true ) {
    bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar44 = bVar38 - 0x30;
    if (9 < bVar44) {
      if (bVar38 != 0x2e) goto LAB_018a63a6;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a620c;
    }
    uVar40 = (0x8000000000000000 - (ulong)bVar44) / 10;
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if ((SBORROW8(lVar41,-uVar40) != (long)(lVar41 + uVar40) < 0) ||
       (((lVar41 = lVar41 * 10 - (ulong)bVar44, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a6044:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a61be;
  }
  goto LAB_018a1933;
LAB_018a620c:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a61be;
    goto LAB_018a1933;
  }
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a63a6;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar44 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar44;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a620c;
LAB_018a63a6:
  uVar47 = (uint)bVar38;
  if (uVar47 - 9 < 5) {
LAB_018a63b5:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a61be:
    bVar15 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,true>
                       ((IntegerDecimalCastData<unsigned_int> *)&pos_1);
    goto LAB_018a61c8;
  }
  if ((uVar47 == 0x65) || (uVar47 == 0x45)) {
    if ((uVar40 != 1) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<unsigned_int>,true>
                           ((IntegerDecimalCastData<unsigned_int> *)&pos_1,exponent.result);
        goto joined_r0x018a6b08;
      }
    }
  }
  else if (uVar47 == 0x20) goto LAB_018a63b5;
  goto LAB_018a1933;
LAB_018a62bb:
  if (uVar26 + size <= uVar34) goto LAB_018a638d;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar34] == 0x30) {
    uVar40 = 0;
  }
  else {
    uVar40 = 1;
    if (((byte *)value_ptr)[uVar49 + 1 + uVar34] != 0x31) goto LAB_018a1933;
  }
  uVar50 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar34] & 0xfe) != 0x30)) goto LAB_018a1933;
      uVar50 = uVar34 + 2;
    }
    else {
      uVar50 = uVar34 + 1;
    }
  }
  uVar34 = uVar50;
  if (0x3fffffffffffffff < lVar41) goto LAB_018a1933;
  lVar41 = uVar40 + lVar41 * 2;
  goto LAB_018a62bb;
LAB_018a638d:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                     ((IntegerDecimalCastData<unsigned_int> *)&pos_1);
  goto LAB_018a6b03;
LAB_018a5ea0:
  if (uVar26 + size <= uVar34) goto LAB_018a6a54;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar34];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a1933;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar40 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar34]), !bVar15))
      goto LAB_018a1933;
      uVar40 = uVar34 + 2;
    }
    else {
      uVar40 = uVar34 + 1;
    }
  }
  if ((long)((ulong)((byte)(cVar43 + bVar44) >> 4) ^ 0x7ffffffffffffff) < lVar41) goto LAB_018a1933;
  lVar41 = lVar41 * 0x10 + (ulong)(byte)(cVar43 + bVar44);
  uVar34 = uVar40;
  goto LAB_018a5ea0;
LAB_018a6a54:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                     ((IntegerDecimalCastData<unsigned_int> *)&pos_1);
  goto LAB_018a6b03;
  while( true ) {
    bVar44 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar38 = bVar44 - 0x30;
    if (9 < bVar38) {
      if (bVar44 != 0x2e) goto LAB_018a6343;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a6114;
    }
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if (((long)(((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10) < lVar41) ||
       (((lVar41 = lVar41 * 10 + (ulong)bVar38, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a5f9a:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a60e0;
  }
  goto LAB_018a1933;
LAB_018a6114:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a60e0;
    goto LAB_018a1933;
  }
  bVar44 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar38 = bVar44 - 0x30;
  if (9 < bVar38) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a6343;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar38;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a6114;
LAB_018a6343:
  if (bVar44 - 9 < 5) {
LAB_018a6352:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a60e0:
    bVar15 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                       ((IntegerDecimalCastData<unsigned_int> *)&pos_1);
    goto LAB_018a60ea;
  }
  if ((bVar44 == 0x65) || (bVar44 == 0x45)) {
    if ((uVar40 != local_278) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                           ((IntegerDecimalCastData<unsigned_int> *)&pos_1,exponent.result);
        goto joined_r0x018a6b08;
      }
    }
  }
  else if (bVar44 == 0x20) goto LAB_018a6352;
  goto LAB_018a1933;
  while (lVar41 = uVar49 + uVar34, uVar34 = uVar34 + 1, ((byte *)value_ptr)[lVar41] == 0x30) {
LAB_018a0cfe:
    if (uVar26 <= uVar34) {
      uVar45 = 0;
      uVar34 = 1;
      goto LAB_018a294b;
    }
  }
LAB_018a51ac:
  for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
    bVar38 = ((byte *)value_ptr)[uVar49];
    if ((0x20 < (ulong)bVar38) || ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) == 0)) {
      local_218[0]._M_allocated_capacity = 0;
      pos_1._0_1_ = 0;
      pos_1._1_1_ = 0;
      uVar33 = pos_1._1_1_;
      pos_1._2_2_ = 0;
      uVar11 = pos_1._2_2_;
      pos_1._4_4_ = 0;
      uVar5 = pos_1._4_4_;
      uStack_220 = 0;
      uVar12 = uStack_220;
      uStack_21c = 0;
      uVar13 = uStack_21c;
      uVar26 = ~uVar49;
      bVar15 = SUB81(uVar34,0);
      if (bVar38 == 0x2d) {
        uVar40 = 1;
        goto LAB_018a5204;
      }
      if (bVar38 == 0x30 && size - 1 != uVar49) {
        bVar44 = ((byte *)value_ptr)[uVar49 + 1];
        if (bVar44 == 0x42) {
LAB_018a5664:
          lVar41 = 0;
          uVar34 = 1;
          goto LAB_018a5671;
        }
        if (bVar44 != 0x78) {
          if (bVar44 == 0x62) goto LAB_018a5664;
          if (bVar44 != 0x58) goto LAB_018a5363;
        }
        lVar41 = 0;
        uVar34 = 1;
        goto LAB_018a526a;
      }
LAB_018a5363:
      local_278 = (ulong)(bVar38 == 0x2b);
      lVar41 = 0;
      uVar40 = local_278;
      goto LAB_018a5378;
    }
  }
  goto LAB_018a1933;
LAB_018a294b:
  uVar40 = uVar34;
  if (uVar26 <= uVar40) goto joined_r0x018a51a6;
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  if (9 < (byte)(bVar38 - 0x30)) {
    if (bVar38 == 0x2e) {
      if (uVar26 <= uVar40 + 1) goto joined_r0x018a51a6;
      if ((uVar40 < 2) ||
         (bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar40], uVar40 = uVar40 + 1,
         (byte)(bVar38 - 0x30) < 10)) goto LAB_018a51ac;
    }
    if ((bVar38 < 0x21) && ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) {
      uVar34 = uVar40 + 1;
      uVar40 = uVar34;
      if (uVar34 < uVar26) {
        uVar40 = uVar26;
      }
      goto LAB_018a477c;
    }
    goto LAB_018a51ac;
  }
  uVar45 = uVar45 * 10 - (ushort)(byte)(bVar38 - 0x30);
  uVar34 = uVar26;
  if (((~uVar40 + size != uVar49) &&
      (uVar34 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     (((size - uVar40) - 2 == uVar49 ||
      (uVar34 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a51ac;
  goto LAB_018a294b;
LAB_018a477c:
  if (uVar26 <= uVar34) goto joined_r0x018a51a6;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar34]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar34] & 0x3f) & 1) == 0))
  goto LAB_018a51ac;
  uVar34 = uVar34 + 1;
  goto LAB_018a477c;
LAB_018a2ed2:
  if (uVar34 <= uVar40) goto joined_r0x018a51a6;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x30) {
    sVar37 = 0;
  }
  else {
    if (((byte *)value_ptr)[uVar49 + 1 + uVar40] != 0x31) goto LAB_018a51ac;
    sVar37 = 1;
  }
  uVar26 = uVar34;
  if ((size - uVar40) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar40] == 0x5f) {
      if (((size - uVar40) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar40] & 0xfe) != 0x30)) goto LAB_018a51ac;
      uVar26 = uVar40 + 2;
    }
    else {
      uVar26 = uVar40 + 1;
    }
  }
  uVar40 = uVar26;
  if ((short)uVar45 < 0) goto LAB_018a51ac;
  uVar45 = sVar37 + uVar45 * 2;
  goto LAB_018a2ed2;
LAB_018a1b04:
  if (uVar34 <= uVar40) goto joined_r0x018a51a6;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar40];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a51ac;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar26 = uVar34;
  if ((size - uVar40) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar40] == 0x5f) {
      if (((size - uVar40) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar40]), !bVar15))
      goto LAB_018a51ac;
      uVar26 = uVar40 + 2;
    }
    else {
      uVar26 = uVar40 + 1;
    }
  }
  if ((ushort)((byte)(cVar43 + bVar44) >> 4 ^ 0xfff) < uVar45) goto LAB_018a51ac;
  uVar45 = uVar45 * 0x10 + (ushort)(byte)(cVar43 + bVar44);
  uVar40 = uVar26;
  goto LAB_018a1b04;
joined_r0x018a51a6:
  if (1 < uVar40) goto LAB_018a534f;
  goto LAB_018a51ac;
LAB_018a2365:
  uVar50 = uVar26;
  if (uVar34 <= uVar50) goto LAB_018a2bfd;
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    if (bVar38 == 0x2e) {
      uVar26 = uVar50 + 1;
      if (uVar34 <= uVar26) {
        bVar15 = uVar40 < uVar50;
        uVar50 = uVar26;
        if (bVar15) goto LAB_018a2bfd;
        goto LAB_018a51ac;
      }
      if ((uVar50 <= uVar40) ||
         (bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar50], uVar50 = uVar26,
         (byte)(bVar38 - 0x30) < 10)) goto LAB_018a51ac;
    }
    if ((bVar38 < 0x21) && ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) {
      uVar26 = uVar50 + 1;
      uVar50 = uVar26;
      if (uVar26 < uVar34) {
        uVar50 = uVar34;
      }
      goto LAB_018a416d;
    }
    goto LAB_018a51ac;
  }
  if (((ushort)~(ushort)bVar44 / 10 < uVar45) ||
     (((uVar45 = (ushort)bVar44 + uVar45 * 10, uVar26 = uVar34, ~uVar50 + size != uVar49 &&
       (uVar26 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
      (((size - uVar50) - 2 == uVar49 ||
       (uVar26 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
  goto LAB_018a51ac;
  goto LAB_018a2365;
LAB_018a416d:
  if (uVar34 <= uVar26) goto LAB_018a2bfd;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
  goto LAB_018a51ac;
  uVar26 = uVar26 + 1;
  goto LAB_018a416d;
LAB_018a2bfd:
  if (uVar40 < uVar50) {
LAB_018a534f:
    *(ushort *)((long)local_260 + local_258 * 2) = uVar45;
    goto LAB_018a1a7f;
  }
  goto LAB_018a51ac;
  while (lVar41 = uVar49 + uVar40, uVar40 = uVar40 + 1, ((byte *)value_ptr)[lVar41] == 0x30) {
LAB_018a5204:
    if (uVar34 <= uVar40) {
      lVar41 = 0;
      uVar40 = 1;
      goto LAB_018a5422;
    }
  }
  goto LAB_018a1933;
  while( true ) {
    bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar44 = bVar38 - 0x30;
    if (9 < bVar44) {
      if (bVar38 != 0x2e) goto LAB_018a5758;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a55c2;
    }
    uVar40 = (0x8000000000000000 - (ulong)bVar44) / 10;
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if ((SBORROW8(lVar41,-uVar40) != (long)(lVar41 + uVar40) < 0) ||
       (((lVar41 = lVar41 * 10 - (ulong)bVar44, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a5422:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a5594;
  }
  goto LAB_018a1933;
LAB_018a55c2:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a5594;
    goto LAB_018a1933;
  }
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a5758;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar44 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar44;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a55c2;
LAB_018a5758:
  uVar47 = (uint)bVar38;
  if (uVar47 - 9 < 5) {
LAB_018a5767:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a5594:
    bVar15 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                       ((IntegerDecimalCastData<unsigned_short> *)&pos_1);
    goto LAB_018a66fa;
  }
  if ((uVar47 == 0x65) || (uVar47 == 0x45)) {
    if ((uVar40 != 1) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                           ((IntegerDecimalCastData<unsigned_short> *)&pos_1,exponent.result);
        goto joined_r0x018a6a95;
      }
    }
  }
  else if (uVar47 == 0x20) goto LAB_018a5767;
  goto LAB_018a1933;
LAB_018a5671:
  if (uVar26 + size <= uVar34) goto LAB_018a5743;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar34] == 0x30) {
    uVar40 = 0;
  }
  else {
    uVar40 = 1;
    if (((byte *)value_ptr)[uVar49 + 1 + uVar34] != 0x31) goto LAB_018a1933;
  }
  uVar50 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar34] & 0xfe) != 0x30)) goto LAB_018a1933;
      uVar50 = uVar34 + 2;
    }
    else {
      uVar50 = uVar34 + 1;
    }
  }
  uVar34 = uVar50;
  if (0x3fffffffffffffff < lVar41) goto LAB_018a1933;
  lVar41 = uVar40 + lVar41 * 2;
  goto LAB_018a5671;
LAB_018a5743:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                     ((IntegerDecimalCastData<unsigned_short> *)&pos_1);
  goto LAB_018a6a90;
LAB_018a526a:
  if (uVar26 + size <= uVar34) goto LAB_018a6a29;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar34];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a1933;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar40 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar34]), !bVar15))
      goto LAB_018a1933;
      uVar40 = uVar34 + 2;
    }
    else {
      uVar40 = uVar34 + 1;
    }
  }
  if ((long)((ulong)((byte)(cVar43 + bVar44) >> 4) ^ 0x7ffffffffffffff) < lVar41) goto LAB_018a1933;
  lVar41 = lVar41 * 0x10 + (ulong)(byte)(cVar43 + bVar44);
  uVar34 = uVar40;
  goto LAB_018a526a;
LAB_018a6a29:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                     ((IntegerDecimalCastData<unsigned_short> *)&pos_1);
  goto LAB_018a6a90;
  while( true ) {
    bVar44 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar38 = bVar44 - 0x30;
    if (9 < bVar38) {
      if (bVar44 != 0x2e) goto LAB_018a56f9;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a54ea;
    }
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if (((long)(((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10) < lVar41) ||
       (((lVar41 = lVar41 * 10 + (ulong)bVar38, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a5378:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a54be;
  }
  goto LAB_018a1933;
LAB_018a54ea:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a54be;
    goto LAB_018a1933;
  }
  bVar44 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar38 = bVar44 - 0x30;
  if (9 < bVar38) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a56f9;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar38;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a54ea;
LAB_018a56f9:
  if (bVar44 - 9 < 5) {
LAB_018a5708:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a54be:
    bVar15 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                       ((IntegerDecimalCastData<unsigned_short> *)&pos_1);
    goto LAB_018a67d9;
  }
  if ((bVar44 == 0x65) || (bVar44 == 0x45)) {
    if ((uVar40 != local_278) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                           ((IntegerDecimalCastData<unsigned_short> *)&pos_1,exponent.result);
        goto joined_r0x018a6a95;
      }
    }
  }
  else if (bVar44 == 0x20) goto LAB_018a5708;
  goto LAB_018a1933;
  while (lVar41 = uVar49 + uVar34, uVar34 = uVar34 + 1, ((byte *)value_ptr)[lVar41] == 0x30) {
LAB_018a0e69:
    if (uVar26 <= uVar34) {
      bVar38 = 0;
      uVar34 = 1;
      goto LAB_018a29c6;
    }
  }
LAB_018a57a8:
  for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
    bVar38 = ((byte *)value_ptr)[uVar49];
    if ((0x20 < (ulong)bVar38) || ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) == 0)) {
      local_218[0]._M_allocated_capacity = 0;
      pos_1._0_1_ = 0;
      pos_1._1_1_ = 0;
      uVar33 = pos_1._1_1_;
      pos_1._2_2_ = 0;
      uVar11 = pos_1._2_2_;
      pos_1._4_4_ = 0;
      uVar5 = pos_1._4_4_;
      uStack_220 = 0;
      uVar12 = uStack_220;
      uStack_21c = 0;
      uVar13 = uStack_21c;
      uVar26 = ~uVar49;
      bVar15 = SUB81(uVar34,0);
      if (bVar38 == 0x2d) {
        uVar40 = 1;
        goto LAB_018a5813;
      }
      if (bVar38 == 0x30 && size - 1 != uVar49) {
        bVar44 = ((byte *)value_ptr)[uVar49 + 1];
        if (bVar44 == 0x42) {
LAB_018a5c87:
          lVar41 = 0;
          uVar34 = 1;
          goto LAB_018a5c94;
        }
        if (bVar44 != 0x78) {
          if (bVar44 == 0x62) goto LAB_018a5c87;
          if (bVar44 != 0x58) goto LAB_018a595e;
        }
        lVar41 = 0;
        uVar34 = 1;
        goto LAB_018a5879;
      }
LAB_018a595e:
      local_278 = (ulong)(bVar38 == 0x2b);
      lVar41 = 0;
      uVar40 = local_278;
      goto LAB_018a5973;
    }
  }
  goto LAB_018a1933;
LAB_018a29c6:
  uVar40 = uVar34;
  if (uVar26 <= uVar40) goto joined_r0x018a57a6;
  bVar44 = ((byte *)value_ptr)[uVar49 + uVar40];
  if (9 < (byte)(bVar44 - 0x30)) {
    if (bVar44 == 0x2e) {
      if (uVar26 <= uVar40 + 1) goto joined_r0x018a57a6;
      if ((uVar40 < 2) ||
         (bVar44 = ((byte *)value_ptr)[uVar49 + 1 + uVar40], uVar40 = uVar40 + 1,
         (byte)(bVar44 - 0x30) < 10)) goto LAB_018a57a8;
    }
    if ((bVar44 < 0x21) && ((0x100003e00U >> ((ulong)bVar44 & 0x3f) & 1) != 0)) {
      uVar34 = uVar40 + 1;
      uVar40 = uVar34;
      if (uVar34 < uVar26) {
        uVar40 = uVar26;
      }
      goto LAB_018a47ee;
    }
    goto LAB_018a57a8;
  }
  bVar38 = (bVar38 * '\n' - bVar44) + 0x30;
  uVar34 = uVar26;
  if (((~uVar40 + size != uVar49) &&
      (uVar34 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     (((size - uVar40) - 2 == uVar49 ||
      (uVar34 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a57a8;
  goto LAB_018a29c6;
LAB_018a47ee:
  if (uVar26 <= uVar34) goto joined_r0x018a57a6;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar34]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar34] & 0x3f) & 1) == 0))
  goto LAB_018a57a8;
  uVar34 = uVar34 + 1;
  goto LAB_018a47ee;
LAB_018a2f5b:
  if (uVar34 <= uVar40) goto joined_r0x018a57a6;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x30) {
    bVar44 = 0;
  }
  else {
    if (((byte *)value_ptr)[uVar49 + 1 + uVar40] != 0x31) goto LAB_018a57a8;
    bVar44 = 1;
  }
  uVar26 = uVar34;
  if ((size - uVar40) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar40] == 0x5f) {
      if (((size - uVar40) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar40] & 0xfe) != 0x30)) goto LAB_018a57a8;
      uVar26 = uVar40 + 2;
    }
    else {
      uVar26 = uVar40 + 1;
    }
  }
  uVar40 = uVar26;
  if ((char)bVar38 < '\0') goto LAB_018a57a8;
  bVar38 = bVar44 | bVar38 * '\x02';
  goto LAB_018a2f5b;
LAB_018a1c4b:
  if (uVar34 <= uVar40) goto joined_r0x018a57a6;
  bVar44 = ((byte *)value_ptr)[uVar49 + 1 + uVar40];
  bVar19 = bVar44 | 0x20;
  if (0x19 < (byte)(bVar44 + 0xbf)) {
    bVar19 = bVar44;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar19);
  if (!bVar15) goto LAB_018a57a8;
  cVar43 = -0x30;
  if ('`' < (char)bVar19) {
    cVar43 = -0x57;
  }
  uVar26 = uVar34;
  if ((size - uVar40) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar40] == 0x5f) {
      if (((size - uVar40) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar40]), !bVar15))
      goto LAB_018a57a8;
      uVar26 = uVar40 + 2;
    }
    else {
      uVar26 = uVar40 + 1;
    }
  }
  if ((byte)~(cVar43 + bVar19) >> 4 < bVar38) goto LAB_018a57a8;
  bVar38 = cVar43 + bVar19 + bVar38 * '\x10';
  uVar40 = uVar26;
  goto LAB_018a1c4b;
joined_r0x018a57a6:
  if (1 < uVar40) goto LAB_018a57e0;
  goto LAB_018a57a8;
LAB_018a2406:
  uVar50 = uVar26;
  if (uVar34 <= uVar50) goto LAB_018a2c0e;
  bVar44 = ((byte *)value_ptr)[uVar49 + uVar50];
  if (9 < (byte)(bVar44 - 0x30)) {
    if (bVar44 == 0x2e) {
      uVar26 = uVar50 + 1;
      if (uVar34 <= uVar26) {
        bVar15 = uVar40 < uVar50;
        uVar50 = uVar26;
        if (bVar15) goto LAB_018a2c0e;
        goto LAB_018a57a8;
      }
      if ((uVar50 <= uVar40) ||
         (bVar44 = ((byte *)value_ptr)[uVar49 + 1 + uVar50], uVar50 = uVar26,
         (byte)(bVar44 - 0x30) < 10)) goto LAB_018a57a8;
    }
    if ((bVar44 < 0x21) && ((0x100003e00U >> ((ulong)bVar44 & 0x3f) & 1) != 0)) {
      uVar26 = uVar50 + 1;
      uVar50 = uVar26;
      if (uVar26 < uVar34) {
        uVar50 = uVar34;
      }
      goto LAB_018a41d7;
    }
    goto LAB_018a57a8;
  }
  if (((byte)(0x2f - bVar44) / 10 < bVar38) ||
     (((bVar38 = (bVar44 - 0x30) + bVar38 * '\n', uVar26 = uVar34, ~uVar50 + size != uVar49 &&
       (uVar26 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
      (((size - uVar50) - 2 == uVar49 ||
       (uVar26 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
  goto LAB_018a57a8;
  goto LAB_018a2406;
LAB_018a41d7:
  if (uVar34 <= uVar26) goto LAB_018a2c0e;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
  goto LAB_018a57a8;
  uVar26 = uVar26 + 1;
  goto LAB_018a41d7;
LAB_018a2c0e:
  if (uVar40 < uVar50) goto LAB_018a57e0;
  goto LAB_018a57a8;
  while (lVar41 = uVar49 + uVar40, uVar40 = uVar40 + 1, ((byte *)value_ptr)[lVar41] == 0x30) {
LAB_018a5813:
    if (uVar34 <= uVar40) {
      lVar41 = 0;
      uVar40 = 1;
      goto LAB_018a5a1d;
    }
  }
  goto LAB_018a1933;
  while( true ) {
    bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar44 = bVar38 - 0x30;
    if (9 < bVar44) {
      if (bVar38 != 0x2e) goto LAB_018a5d7f;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a5be5;
    }
    uVar40 = (0x8000000000000000 - (ulong)bVar44) / 10;
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if ((SBORROW8(lVar41,-uVar40) != (long)(lVar41 + uVar40) < 0) ||
       (((lVar41 = lVar41 * 10 - (ulong)bVar44, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a5a1d:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a5b97;
  }
  goto LAB_018a1933;
LAB_018a5be5:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a5b97;
    goto LAB_018a1933;
  }
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a5d7f;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar44 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar44;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a5be5;
LAB_018a5d7f:
  uVar47 = (uint)bVar38;
  if (uVar47 - 9 < 5) {
LAB_018a5d8e:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a5b97:
    bVar15 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                       ((IntegerDecimalCastData<unsigned_char> *)&pos_1);
    goto LAB_018a5ba1;
  }
  if ((uVar47 == 0x65) || (uVar47 == 0x45)) {
    if ((uVar40 != 1) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                           ((IntegerDecimalCastData<unsigned_char> *)&pos_1,exponent.result);
        goto joined_r0x018a6ae2;
      }
    }
  }
  else if (uVar47 == 0x20) goto LAB_018a5d8e;
  goto LAB_018a1933;
LAB_018a5c94:
  if (uVar26 + size <= uVar34) goto LAB_018a5d66;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar34] == 0x30) {
    uVar40 = 0;
  }
  else {
    uVar40 = 1;
    if (((byte *)value_ptr)[uVar49 + 1 + uVar34] != 0x31) goto LAB_018a1933;
  }
  uVar50 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar34] & 0xfe) != 0x30)) goto LAB_018a1933;
      uVar50 = uVar34 + 2;
    }
    else {
      uVar50 = uVar34 + 1;
    }
  }
  uVar34 = uVar50;
  if (0x3fffffffffffffff < lVar41) goto LAB_018a1933;
  lVar41 = uVar40 + lVar41 * 2;
  goto LAB_018a5c94;
LAB_018a5d66:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                     ((IntegerDecimalCastData<unsigned_char> *)&pos_1);
  goto LAB_018a6add;
LAB_018a5879:
  if (uVar26 + size <= uVar34) goto LAB_018a6a3d;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar34];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a1933;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar40 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar34]), !bVar15))
      goto LAB_018a1933;
      uVar40 = uVar34 + 2;
    }
    else {
      uVar40 = uVar34 + 1;
    }
  }
  if ((long)((ulong)((byte)(cVar43 + bVar44) >> 4) ^ 0x7ffffffffffffff) < lVar41) goto LAB_018a1933;
  lVar41 = lVar41 * 0x10 + (ulong)(byte)(cVar43 + bVar44);
  uVar34 = uVar40;
  goto LAB_018a5879;
LAB_018a6a3d:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                     ((IntegerDecimalCastData<unsigned_char> *)&pos_1);
  goto LAB_018a6add;
  while( true ) {
    bVar44 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar38 = bVar44 - 0x30;
    if (9 < bVar38) {
      if (bVar44 != 0x2e) goto LAB_018a5d1c;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a5aed;
    }
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if (((long)(((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10) < lVar41) ||
       (((lVar41 = lVar41 * 10 + (ulong)bVar38, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a5973:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a5ab9;
  }
  goto LAB_018a1933;
LAB_018a5aed:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a5ab9;
    goto LAB_018a1933;
  }
  bVar44 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar38 = bVar44 - 0x30;
  if (9 < bVar38) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a5d1c;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar38;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a5aed;
LAB_018a5d1c:
  if (bVar44 - 9 < 5) {
LAB_018a5d2b:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a5ab9:
    bVar15 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                       ((IntegerDecimalCastData<unsigned_char> *)&pos_1);
    goto LAB_018a5ac3;
  }
  if ((bVar44 == 0x65) || (bVar44 == 0x45)) {
    if ((uVar40 != local_278) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                           ((IntegerDecimalCastData<unsigned_char> *)&pos_1,exponent.result);
        goto joined_r0x018a6ae2;
      }
    }
  }
  else if (bVar44 == 0x20) goto LAB_018a5d2b;
  goto LAB_018a1933;
LAB_018a181e:
  while (((pbVar42 < last && ((ulong)*pbVar42 < 0x21)) &&
         ((0x100003e00U >> ((ulong)*pbVar42 & 0x3f) & 1) != 0))) {
    pbVar42 = pbVar42 + 1;
  }
  goto LAB_018a1823;
LAB_018a17b2:
  while (((pbVar42 < last && ((ulong)*pbVar42 < 0x21)) &&
         ((0x100003e00U >> ((ulong)*pbVar42 & 0x3f) & 1) != 0))) {
    pbVar42 = pbVar42 + 1;
  }
LAB_018a1823:
  if (pbVar42 == last) goto LAB_018a1a7f;
  goto LAB_018a1933;
LAB_018a11b3:
  uVar50 = uVar34;
  if (uVar26 <= uVar50) goto joined_r0x018a3af8;
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    if (bVar38 == 0x2e) {
      if (uVar26 <= uVar50 + 1) goto joined_r0x018a3af8;
      if ((uVar50 < 2) ||
         (bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar50], uVar50 = uVar50 + 1,
         (byte)(bVar38 - 0x30) < 10)) goto LAB_018a3afe;
    }
    if ((bVar38 < 0x21) && ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) {
      uVar34 = uVar50 + 1;
      uVar50 = uVar34;
      if (uVar34 < uVar26) {
        uVar50 = uVar26;
      }
      goto LAB_018a3ad5;
    }
    goto LAB_018a3afe;
  }
  uVar34 = (0x8000000000000000 - (ulong)bVar44) / 10;
  if ((SBORROW8(uVar40,-uVar34) != (long)(uVar40 + uVar34) < 0) ||
     (((uVar40 = uVar40 * 10 - (ulong)bVar44, uVar34 = uVar26, ~uVar50 + size != uVar49 &&
       (uVar34 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
      (((size - uVar50) - 2 == uVar49 ||
       (uVar34 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
  goto LAB_018a3afe;
  goto LAB_018a11b3;
LAB_018a3ad5:
  if (uVar26 <= uVar34) goto joined_r0x018a3af8;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar34]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar34] & 0x3f) & 1) == 0))
  goto LAB_018a3afe;
  uVar34 = uVar34 + 1;
  goto LAB_018a3ad5;
LAB_018a30fa:
  if (uVar34 <= uVar50) goto joined_r0x018a3af8;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x30) {
    uVar26 = 0;
  }
  else {
    uVar26 = 1;
    if (((byte *)value_ptr)[uVar49 + 1 + uVar50] != 0x31) goto LAB_018a3afe;
  }
  uVar29 = uVar34;
  if ((size - uVar50) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar50] == 0x5f) {
      if (((size - uVar50) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar50] & 0xfe) != 0x30)) goto LAB_018a3afe;
      uVar29 = uVar50 + 2;
    }
    else {
      uVar29 = uVar50 + 1;
    }
  }
  uVar50 = uVar29;
  if (0x3fffffffffffffff < (long)uVar40) goto LAB_018a3afe;
  uVar40 = uVar26 + uVar40 * 2;
  goto LAB_018a30fa;
LAB_018a1ff5:
  if (uVar34 <= uVar50) goto joined_r0x018a3af8;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar50];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a3afe;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar26 = uVar34;
  if ((size - uVar50) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar50] == 0x5f) {
      if (((size - uVar50) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar50]), !bVar15))
      goto LAB_018a3afe;
      uVar26 = uVar50 + 2;
    }
    else {
      uVar26 = uVar50 + 1;
    }
  }
  if ((long)((ulong)((byte)(cVar43 + bVar44) >> 4) ^ 0x7ffffffffffffff) < (long)uVar40)
  goto LAB_018a3afe;
  uVar40 = uVar40 * 0x10 + (ulong)(byte)(cVar43 + bVar44);
  uVar50 = uVar26;
  goto LAB_018a1ff5;
joined_r0x018a3af8:
  if (1 < uVar50) goto LAB_018a63fa;
  goto LAB_018a3afe;
LAB_018a25f5:
  uVar29 = uVar26;
  if (uVar34 <= uVar29) goto LAB_018a2c41;
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar29];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    if (bVar38 == 0x2e) {
      uVar26 = uVar29 + 1;
      if (uVar34 <= uVar26) {
        bVar15 = uVar50 < uVar29;
        uVar29 = uVar26;
        if (bVar15) goto LAB_018a2c41;
        goto LAB_018a3afe;
      }
      if ((uVar29 <= uVar50) ||
         (bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar29], uVar29 = uVar26,
         (byte)(bVar38 - 0x30) < 10)) goto LAB_018a3afe;
    }
    if ((bVar38 < 0x21) && ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) {
      uVar26 = uVar29 + 1;
      uVar29 = uVar26;
      if (uVar26 < uVar34) {
        uVar29 = uVar34;
      }
      goto LAB_018a4311;
    }
    goto LAB_018a3afe;
  }
  if (((long)(((ulong)bVar44 ^ 0x7ffffffffffffffe) / 10) < (long)uVar40) ||
     (((uVar40 = uVar40 * 10 + (ulong)bVar44, uVar26 = uVar34, ~uVar29 + size != uVar49 &&
       (uVar26 = uVar29 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar29] == 0x5f)) &&
      (((size - uVar29) - 2 == uVar49 ||
       (uVar26 = uVar29 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar29] - 0x30)))))))
  goto LAB_018a3afe;
  goto LAB_018a25f5;
LAB_018a4311:
  if (uVar34 <= uVar26) goto LAB_018a2c41;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
  goto LAB_018a3afe;
  uVar26 = uVar26 + 1;
  goto LAB_018a4311;
LAB_018a2c41:
  if (uVar50 < uVar29) {
LAB_018a63fa:
    *(ulong *)((long)local_260 + local_258 * 8) = uVar40;
    goto LAB_018a1a7f;
  }
LAB_018a3afe:
  for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
    bVar38 = ((byte *)value_ptr)[uVar49];
    if ((0x20 < (ulong)bVar38) || ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) == 0)) {
      local_218[0]._M_allocated_capacity = 0;
      pos_1._0_1_ = 0;
      pos_1._1_1_ = 0;
      uVar33 = pos_1._1_1_;
      pos_1._2_2_ = 0;
      uVar11 = pos_1._2_2_;
      pos_1._4_4_ = 0;
      uVar5 = pos_1._4_4_;
      uStack_220 = 0;
      uVar12 = uStack_220;
      uStack_21c = 0;
      uVar13 = uStack_21c;
      uVar26 = ~uVar49;
      bVar15 = SUB81(uVar34,0);
      if (bVar38 == 0x2d) {
        lVar41 = 0;
        uVar40 = 1;
        goto LAB_018a3b60;
      }
      if (bVar38 == 0x30 && size - 1 != uVar49) {
        bVar44 = ((byte *)value_ptr)[uVar49 + 1];
        if (bVar44 == 0x42) {
LAB_018a45c7:
          lVar41 = 0;
          uVar34 = 1;
          goto LAB_018a45d4;
        }
        if (bVar44 != 0x78) {
          if (bVar44 == 0x62) goto LAB_018a45c7;
          if (bVar44 != 0x58) goto LAB_018a3d2a;
        }
        lVar41 = 0;
        uVar34 = 1;
        goto LAB_018a3c45;
      }
LAB_018a3d2a:
      local_278 = (ulong)(bVar38 == 0x2b);
      lVar41 = 0;
      uVar40 = local_278;
      goto LAB_018a3d3f;
    }
  }
  goto LAB_018a1933;
  while( true ) {
    bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar44 = bVar38 - 0x30;
    if (9 < bVar44) {
      if (bVar38 != 0x2e) goto LAB_018a46f6;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a3e0c;
    }
    uVar40 = (0x8000000000000000 - (ulong)bVar44) / 10;
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if ((SBORROW8(lVar41,-uVar40) != (long)(lVar41 + uVar40) < 0) ||
       (((lVar41 = lVar41 * 10 - (ulong)bVar44, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a3b60:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a3dde;
  }
  goto LAB_018a1933;
LAB_018a3e0c:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a3dde;
    goto LAB_018a1933;
  }
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a46f6;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar44 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar44;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a3e0c;
LAB_018a46f6:
  uVar47 = (uint)bVar38;
  if (uVar47 - 9 < 5) {
LAB_018a4705:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a3dde:
    bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,true>
                       ((IntegerDecimalCastData<long> *)&pos_1);
LAB_018a4c86:
    bVar16 = 1 < uVar40;
    goto LAB_018a4c8d;
  }
  if ((uVar47 == 0x65) || (uVar47 == 0x45)) {
    if ((uVar40 != 1) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<long>,true>
                           ((IntegerDecimalCastData<long> *)&pos_1,exponent.result);
        goto joined_r0x018a6b2e;
      }
    }
  }
  else if (uVar47 == 0x20) goto LAB_018a4705;
  goto LAB_018a1933;
LAB_018a45d4:
  if (uVar26 + size <= uVar34) goto LAB_018a518c;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar34] == 0x30) {
    uVar40 = 0;
  }
  else {
    uVar40 = 1;
    if (((byte *)value_ptr)[uVar49 + 1 + uVar34] != 0x31) goto LAB_018a1933;
  }
  uVar50 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar34] & 0xfe) != 0x30)) goto LAB_018a1933;
      uVar50 = uVar34 + 2;
    }
    else {
      uVar50 = uVar34 + 1;
    }
  }
  uVar34 = uVar50;
  if (0x3fffffffffffffff < lVar41) goto LAB_018a1933;
  lVar41 = uVar40 + lVar41 * 2;
  goto LAB_018a45d4;
LAB_018a518c:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                     ((IntegerDecimalCastData<long> *)&pos_1);
  goto LAB_018a6b29;
LAB_018a3c45:
  if (uVar26 + size <= uVar34) goto LAB_018a6b13;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar34];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a1933;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar40 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar34]), !bVar15))
      goto LAB_018a1933;
      uVar40 = uVar34 + 2;
    }
    else {
      uVar40 = uVar34 + 1;
    }
  }
  if ((long)((ulong)((byte)(cVar43 + bVar44) >> 4) ^ 0x7ffffffffffffff) < lVar41) goto LAB_018a1933;
  lVar41 = lVar41 * 0x10 + (ulong)(byte)(cVar43 + bVar44);
  uVar34 = uVar40;
  goto LAB_018a3c45;
LAB_018a6b13:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                     ((IntegerDecimalCastData<long> *)&pos_1);
LAB_018a6b29:
  bVar15 = (bool)(1 < uVar34 & bVar15);
joined_r0x018a6b2e:
  if (bVar15 != false) {
    *(ulong *)((long)local_260 + local_258 * 8) =
         CONCAT44(pos_1._4_4_,CONCAT22(pos_1._2_2_,CONCAT11(pos_1._1_1_,(undefined1)pos_1)));
    goto LAB_018a1a7f;
  }
  goto LAB_018a1933;
  while( true ) {
    bVar44 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar38 = bVar44 - 0x30;
    if (9 < bVar38) {
      if (bVar44 != 0x2e) goto LAB_018a4fd2;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a408e;
    }
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if (((long)(((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10) < lVar41) ||
       (((lVar41 = lVar41 * 10 + (ulong)bVar38, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a3d3f:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a3ee4;
  }
  goto LAB_018a1933;
LAB_018a408e:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a3ee4;
    goto LAB_018a1933;
  }
  bVar44 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar38 = bVar44 - 0x30;
  if (9 < bVar38) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a4fd2;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar38;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a408e;
LAB_018a4fd2:
  if (4 < bVar44 - 9) {
    if ((bVar44 == 0x65) || (bVar44 == 0x45)) {
      if ((uVar40 != local_278) && (uVar40 + 1 < uVar34)) {
        _exponent = (pointer)((ulong)uStack_24e << 0x10);
        pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
        iVar39 = uVar26 + (size - uVar40);
        if (*pbVar42 == 0x2d) {
          bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             ((char *)pbVar42,iVar39,&exponent,bVar15);
        }
        else {
          bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             ((char *)pbVar42,iVar39,&exponent,bVar15);
        }
        if (bVar15 != false) {
          bVar15 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<long>,false>
                             ((IntegerDecimalCastData<long> *)&pos_1,exponent.result);
          goto joined_r0x018a6b2e;
        }
      }
    }
    else if (bVar44 == 0x20) goto LAB_018a4fe1;
    goto LAB_018a1933;
  }
LAB_018a4fe1:
  uVar26 = uVar40 + 1;
  uVar40 = uVar26;
  if (uVar26 < uVar34) {
    uVar40 = uVar34;
  }
  for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
    if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
       ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
    goto LAB_018a1933;
  }
LAB_018a3ee4:
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                     ((IntegerDecimalCastData<long> *)&pos_1);
LAB_018a4bb2:
  bVar16 = local_278 < uVar40;
LAB_018a4c8d:
  bVar15 = (bool)(bVar15 & bVar16);
  goto joined_r0x018a6b2e;
LAB_018a10cb:
  uVar40 = uVar34;
  if (uVar26 <= uVar40) goto joined_r0x018a36ed;
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    if (bVar38 == 0x2e) {
      if (uVar26 <= uVar40 + 1) goto joined_r0x018a36ed;
      if ((uVar40 < 2) ||
         (bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar40], uVar40 = uVar40 + 1,
         (byte)(bVar38 - 0x30) < 10)) goto LAB_018a36f3;
    }
    if ((bVar38 < 0x21) && ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) {
      uVar34 = uVar40 + 1;
      uVar40 = uVar34;
      if (uVar34 < uVar26) {
        uVar40 = uVar26;
      }
      goto LAB_018a36ca;
    }
    goto LAB_018a36f3;
  }
  uVar21 = (0x80000000 - bVar44) / 10;
  if ((SBORROW4(uVar47,-uVar21) != (int)(uVar47 + uVar21) < 0) ||
     (((uVar47 = uVar47 * 10 - (uint)bVar44, uVar34 = uVar26, ~uVar40 + size != uVar49 &&
       (uVar34 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
      (((size - uVar40) - 2 == uVar49 ||
       (uVar34 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))))
  goto LAB_018a36f3;
  goto LAB_018a10cb;
LAB_018a36ca:
  if (uVar26 <= uVar34) goto joined_r0x018a36ed;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar34]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar34] & 0x3f) & 1) == 0))
  goto LAB_018a36f3;
  uVar34 = uVar34 + 1;
  goto LAB_018a36ca;
LAB_018a306f:
  if (uVar34 <= uVar40) goto joined_r0x018a36ed;
  iVar22 = 0;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar40] != 0x30) {
    if (((byte *)value_ptr)[uVar49 + 1 + uVar40] != 0x31) goto LAB_018a36f3;
    iVar22 = 1;
  }
  uVar26 = uVar34;
  if ((size - uVar40) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar40] == 0x5f) {
      if (((size - uVar40) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar40] & 0xfe) != 0x30)) goto LAB_018a36f3;
      uVar26 = uVar40 + 2;
    }
    else {
      uVar26 = uVar40 + 1;
    }
  }
  uVar40 = uVar26;
  if (0x3fffffff < (int)uVar47) goto LAB_018a36f3;
  uVar47 = iVar22 + uVar47 * 2;
  goto LAB_018a306f;
LAB_018a1ebd:
  if (uVar34 <= uVar40) goto joined_r0x018a36ed;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar40];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a36f3;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar26 = uVar34;
  if ((size - uVar40) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar40] == 0x5f) {
      if (((size - uVar40) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar40]), !bVar15))
      goto LAB_018a36f3;
      uVar26 = uVar40 + 2;
    }
    else {
      uVar26 = uVar40 + 1;
    }
  }
  if ((int)((byte)(cVar43 + bVar44) >> 4 ^ 0x7ffffff) < (int)uVar47) goto LAB_018a36f3;
  uVar47 = uVar47 * 0x10 + (uint)(byte)(cVar43 + bVar44);
  uVar40 = uVar26;
  goto LAB_018a1ebd;
joined_r0x018a36ed:
  if (1 < uVar40) goto LAB_018a5e07;
  goto LAB_018a36f3;
LAB_018a2556:
  uVar50 = uVar26;
  if (uVar34 <= uVar50) goto LAB_018a2c30;
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    if (bVar38 == 0x2e) {
      uVar26 = uVar50 + 1;
      if (uVar34 <= uVar26) {
        bVar15 = uVar40 < uVar50;
        uVar50 = uVar26;
        if (bVar15) goto LAB_018a2c30;
        goto LAB_018a36f3;
      }
      if ((uVar50 <= uVar40) ||
         (bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar50], uVar50 = uVar26,
         (byte)(bVar38 - 0x30) < 10)) goto LAB_018a36f3;
    }
    if ((bVar38 < 0x21) && ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) {
      uVar26 = uVar50 + 1;
      uVar50 = uVar26;
      if (uVar26 < uVar34) {
        uVar50 = uVar34;
      }
      goto LAB_018a42a9;
    }
    goto LAB_018a36f3;
  }
  if (((int)((bVar44 ^ 0x7ffffffe) / 10) < (int)uVar47) ||
     (((uVar47 = uVar47 * 10 + (uint)bVar44, uVar26 = uVar34, ~uVar50 + size != uVar49 &&
       (uVar26 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
      (((size - uVar50) - 2 == uVar49 ||
       (uVar26 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
  goto LAB_018a36f3;
  goto LAB_018a2556;
LAB_018a42a9:
  if (uVar34 <= uVar26) goto LAB_018a2c30;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
  goto LAB_018a36f3;
  uVar26 = uVar26 + 1;
  goto LAB_018a42a9;
LAB_018a2c30:
  if (uVar40 < uVar50) {
LAB_018a5e07:
    *(uint *)((long)local_260 + local_258 * 4) = uVar47;
    goto LAB_018a1a7f;
  }
LAB_018a36f3:
  for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
    bVar38 = ((byte *)value_ptr)[uVar49];
    if ((0x20 < (ulong)bVar38) || ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) == 0)) {
      local_218[0]._M_allocated_capacity = 0;
      pos_1._0_1_ = 0;
      pos_1._1_1_ = 0;
      uVar33 = pos_1._1_1_;
      pos_1._2_2_ = 0;
      uVar11 = pos_1._2_2_;
      pos_1._4_4_ = 0;
      uVar5 = pos_1._4_4_;
      uStack_220 = 0;
      uVar12 = uStack_220;
      uStack_21c = 0;
      uVar13 = uStack_21c;
      uVar26 = ~uVar49;
      bVar15 = SUB81(uVar34,0);
      if (bVar38 == 0x2d) {
        lVar41 = 0;
        uVar40 = 1;
        goto LAB_018a3755;
      }
      if (bVar38 == 0x30 && size - 1 != uVar49) {
        bVar44 = ((byte *)value_ptr)[uVar49 + 1];
        if (bVar44 == 0x42) {
LAB_018a4535:
          lVar41 = 0;
          uVar34 = 1;
          goto LAB_018a4542;
        }
        if (bVar44 != 0x78) {
          if (bVar44 == 0x62) goto LAB_018a4535;
          if (bVar44 != 0x58) goto LAB_018a391f;
        }
        lVar41 = 0;
        uVar34 = 1;
        goto LAB_018a383a;
      }
LAB_018a391f:
      local_278 = (ulong)(bVar38 == 0x2b);
      lVar41 = 0;
      uVar40 = local_278;
      goto LAB_018a3934;
    }
  }
  goto LAB_018a1933;
  while( true ) {
    bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar44 = bVar38 - 0x30;
    if (9 < bVar44) {
      if (bVar38 != 0x2e) goto LAB_018a46a9;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a3a01;
    }
    uVar40 = (0x8000000000000000 - (ulong)bVar44) / 10;
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if ((SBORROW8(lVar41,-uVar40) != (long)(lVar41 + uVar40) < 0) ||
       (((lVar41 = lVar41 * 10 - (ulong)bVar44, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a3755:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a39d3;
  }
  goto LAB_018a1933;
LAB_018a3a01:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a39d3;
    goto LAB_018a1933;
  }
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a46a9;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar44 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar44;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a3a01;
LAB_018a46a9:
  uVar47 = (uint)bVar38;
  if (uVar47 - 9 < 5) {
LAB_018a46b8:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a39d3:
    bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,true>
                       ((IntegerDecimalCastData<int> *)&pos_1);
LAB_018a61c8:
    bVar16 = 1 < uVar40;
    goto LAB_018a61cf;
  }
  if ((uVar47 == 0x65) || (uVar47 == 0x45)) {
    if ((uVar40 != 1) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<int>,true>
                           ((IntegerDecimalCastData<int> *)&pos_1,exponent.result);
        goto joined_r0x018a6b08;
      }
    }
  }
  else if (uVar47 == 0x20) goto LAB_018a46b8;
  goto LAB_018a1933;
LAB_018a4542:
  if (uVar26 + size <= uVar34) goto LAB_018a517a;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar34] == 0x30) {
    uVar40 = 0;
  }
  else {
    uVar40 = 1;
    if (((byte *)value_ptr)[uVar49 + 1 + uVar34] != 0x31) goto LAB_018a1933;
  }
  uVar50 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar34] & 0xfe) != 0x30)) goto LAB_018a1933;
      uVar50 = uVar34 + 2;
    }
    else {
      uVar50 = uVar34 + 1;
    }
  }
  uVar34 = uVar50;
  if (0x3fffffffffffffff < lVar41) goto LAB_018a1933;
  lVar41 = uVar40 + lVar41 * 2;
  goto LAB_018a4542;
LAB_018a517a:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                     ((IntegerDecimalCastData<int> *)&pos_1);
  goto LAB_018a6b03;
LAB_018a383a:
  if (uVar26 + size <= uVar34) goto LAB_018a6aed;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar34];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a1933;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar40 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar34]), !bVar15))
      goto LAB_018a1933;
      uVar40 = uVar34 + 2;
    }
    else {
      uVar40 = uVar34 + 1;
    }
  }
  if ((long)((ulong)((byte)(cVar43 + bVar44) >> 4) ^ 0x7ffffffffffffff) < lVar41) goto LAB_018a1933;
  lVar41 = lVar41 * 0x10 + (ulong)(byte)(cVar43 + bVar44);
  uVar34 = uVar40;
  goto LAB_018a383a;
LAB_018a6aed:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                     ((IntegerDecimalCastData<int> *)&pos_1);
LAB_018a6b03:
  bVar15 = (bool)(1 < uVar34 & bVar15);
joined_r0x018a6b08:
  if (bVar15 != false) {
    *(uint *)((long)local_260 + local_258 * 4) =
         CONCAT22(pos_1._2_2_,CONCAT11(pos_1._1_1_,(undefined1)pos_1));
    goto LAB_018a1a7f;
  }
  goto LAB_018a1933;
  while( true ) {
    bVar44 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar38 = bVar44 - 0x30;
    if (9 < bVar38) {
      if (bVar44 != 0x2e) goto LAB_018a4f85;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a3fcf;
    }
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if (((long)(((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10) < lVar41) ||
       (((lVar41 = lVar41 * 10 + (ulong)bVar38, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a3934:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a3ecd;
  }
  goto LAB_018a1933;
LAB_018a3fcf:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a3ecd;
    goto LAB_018a1933;
  }
  bVar44 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar38 = bVar44 - 0x30;
  if (9 < bVar38) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a4f85;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar38;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a3fcf;
LAB_018a4f85:
  if (4 < bVar44 - 9) {
    if ((bVar44 == 0x65) || (bVar44 == 0x45)) {
      if ((uVar40 != local_278) && (uVar40 + 1 < uVar34)) {
        _exponent = (pointer)((ulong)uStack_24e << 0x10);
        pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
        iVar39 = uVar26 + (size - uVar40);
        if (*pbVar42 == 0x2d) {
          bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             ((char *)pbVar42,iVar39,&exponent,bVar15);
        }
        else {
          bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             ((char *)pbVar42,iVar39,&exponent,bVar15);
        }
        if (bVar15 != false) {
          bVar15 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<int>,false>
                             ((IntegerDecimalCastData<int> *)&pos_1,exponent.result);
          goto joined_r0x018a6b08;
        }
      }
    }
    else if (bVar44 == 0x20) goto LAB_018a4f94;
    goto LAB_018a1933;
  }
LAB_018a4f94:
  uVar26 = uVar40 + 1;
  uVar40 = uVar26;
  if (uVar26 < uVar34) {
    uVar40 = uVar34;
  }
  for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
    if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
       ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
    goto LAB_018a1933;
  }
LAB_018a3ecd:
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                     ((IntegerDecimalCastData<int> *)&pos_1);
LAB_018a60ea:
  bVar16 = local_278 < uVar40;
LAB_018a61cf:
  bVar15 = (bool)(bVar15 & bVar16);
  goto joined_r0x018a6b08;
LAB_018a4414:
  if (uVar26 <= uVar34) goto LAB_018a507e;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar34] == 0x30) {
    sVar37 = 0;
  }
  else {
    if (((byte *)value_ptr)[uVar49 + 1 + uVar34] != 0x31) goto LAB_018a6417;
    sVar37 = 1;
  }
  uVar40 = uVar26;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar34] & 0xfe) != 0x30)) goto LAB_018a6417;
      uVar40 = uVar34 + 2;
    }
    else {
      uVar40 = uVar34 + 1;
    }
  }
  uVar34 = uVar40;
  if (0x3fff < simple_data.result) goto LAB_018a6417;
  simple_data.result = sVar37 + simple_data.result * 2;
  goto LAB_018a4414;
LAB_018a507e:
  IVar20.result = simple_data.result;
  if (uVar34 < 2) goto LAB_018a6417;
  goto LAB_018a67ee;
LAB_018a2810:
  IVar20.result = simple_data.result;
  if (uVar26 <= uVar34) goto LAB_018a640d;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar34];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a6417;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar40 = uVar26;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar34]), !bVar15))
      goto LAB_018a6417;
      uVar40 = uVar34 + 2;
    }
    else {
      uVar40 = uVar34 + 1;
    }
  }
  if ((short)((byte)(cVar43 + bVar44) >> 4 ^ 0x7ff) < IVar20.result) goto LAB_018a6417;
  simple_data.result = IVar20.result * 0x10 + (ushort)(byte)(cVar43 + bVar44);
  uVar34 = uVar40;
  goto LAB_018a2810;
LAB_018a640d:
  if (1 < uVar34) goto LAB_018a67ee;
LAB_018a6417:
  for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
    bVar38 = ((byte *)value_ptr)[uVar49];
    if ((0x20 < (ulong)bVar38) || ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) == 0)) {
      local_218[0]._M_allocated_capacity = 0;
      pos_1._0_1_ = 0;
      pos_1._1_1_ = 0;
      uVar33 = pos_1._1_1_;
      pos_1._2_2_ = 0;
      uVar11 = pos_1._2_2_;
      pos_1._4_4_ = 0;
      uVar5 = pos_1._4_4_;
      uStack_220 = 0;
      uVar12 = uStack_220;
      uStack_21c = 0;
      uVar13 = uStack_21c;
      uVar26 = ~uVar49;
      bVar15 = SUB81(uVar34,0);
      if (bVar38 == 0x2d) {
        lVar41 = 0;
        uVar40 = 1;
        goto LAB_018a6479;
      }
      if (bVar38 == 0x30 && size - 1 != uVar49) {
        bVar44 = ((byte *)value_ptr)[uVar49 + 1];
        if (bVar44 == 0x42) {
LAB_018a68c0:
          lVar41 = 0;
          uVar34 = 1;
          goto LAB_018a68cd;
        }
        if (bVar44 != 0x78) {
          if (bVar44 == 0x62) goto LAB_018a68c0;
          if (bVar44 != 0x58) goto LAB_018a663c;
        }
        uVar34 = 1;
        goto LAB_018a655c;
      }
LAB_018a663c:
      local_278 = (ulong)(bVar38 == 0x2b);
      lVar41 = 0;
      uVar40 = local_278;
      goto LAB_018a6651;
    }
  }
  goto LAB_018a1933;
  while( true ) {
    bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar44 = bVar38 - 0x30;
    if (9 < bVar44) {
      if (bVar38 != 0x2e) goto LAB_018a6955;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a6725;
    }
    uVar40 = (0x8000000000000000 - (ulong)bVar44) / 10;
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if ((SBORROW8(lVar41,-uVar40) != (long)(lVar41 + uVar40) < 0) ||
       (((lVar41 = lVar41 * 10 - (ulong)bVar44, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a6479:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a66f0;
  }
  goto LAB_018a1933;
LAB_018a6725:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a66f0;
    goto LAB_018a1933;
  }
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a6955;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar44 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar44;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a6725;
LAB_018a6955:
  uVar47 = (uint)bVar38;
  if (uVar47 - 9 < 5) {
LAB_018a6964:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a66f0:
    bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
                       ((IntegerDecimalCastData<short> *)&pos_1);
LAB_018a66fa:
    bVar16 = 1 < uVar40;
    goto LAB_018a67e1;
  }
  if ((uVar47 == 0x65) || (uVar47 == 0x45)) {
    if ((uVar40 != 1) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<short>,true>
                           ((IntegerDecimalCastData<short> *)&pos_1,exponent.result);
        goto joined_r0x018a6a95;
      }
    }
  }
  else if (uVar47 == 0x20) goto LAB_018a6964;
  goto LAB_018a1933;
LAB_018a68cd:
  if (uVar26 + size <= uVar34) goto LAB_018a6a16;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar34] == 0x30) {
    uVar40 = 0;
  }
  else {
    uVar40 = 1;
    if (((byte *)value_ptr)[uVar49 + 1 + uVar34] != 0x31) goto LAB_018a1933;
  }
  uVar50 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar34] & 0xfe) != 0x30)) goto LAB_018a1933;
      uVar50 = uVar34 + 2;
    }
    else {
      uVar50 = uVar34 + 1;
    }
  }
  uVar34 = uVar50;
  if (0x3fffffffffffffff < lVar41) goto LAB_018a1933;
  lVar41 = uVar40 + lVar41 * 2;
  goto LAB_018a68cd;
LAB_018a6a16:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                     ((IntegerDecimalCastData<short> *)&pos_1);
  goto LAB_018a6a90;
LAB_018a655c:
  if (uVar26 + size <= uVar34) goto LAB_018a6a82;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar34];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a1933;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar40 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar34]), !bVar15))
      goto LAB_018a1933;
      uVar40 = uVar34 + 2;
    }
    else {
      uVar40 = uVar34 + 1;
    }
  }
  lVar41 = CONCAT44(pos_1._4_4_,CONCAT22(pos_1._2_2_,CONCAT11(pos_1._1_1_,(undefined1)pos_1)));
  if ((long)((ulong)((byte)(cVar43 + bVar44) >> 4) ^ 0x7ffffffffffffff) < lVar41) goto LAB_018a1933;
  lVar41 = lVar41 * 0x10 + (ulong)(byte)(cVar43 + bVar44);
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  uVar34 = uVar40;
  goto LAB_018a655c;
LAB_018a6a82:
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                     ((IntegerDecimalCastData<short> *)&pos_1);
LAB_018a6a90:
  bVar15 = (bool)(1 < uVar34 & bVar15);
joined_r0x018a6a95:
  if (bVar15 != false) {
    IVar20.result = CONCAT11(pos_1._1_1_,(undefined1)pos_1);
LAB_018a67ee:
    *(ResultType_conflict *)((long)local_260 + local_258 * 2) = IVar20.result;
    goto LAB_018a1a7f;
  }
  goto LAB_018a1933;
  while( true ) {
    bVar44 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar38 = bVar44 - 0x30;
    if (9 < bVar38) {
      if (bVar44 != 0x2e) goto LAB_018a69a2;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a681e;
    }
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if (((long)(((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10) < lVar41) ||
       (((lVar41 = lVar41 * 10 + (ulong)bVar38, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a6651:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a67cf;
  }
  goto LAB_018a1933;
LAB_018a681e:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a67cf;
    goto LAB_018a1933;
  }
  bVar44 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar38 = bVar44 - 0x30;
  if (9 < bVar38) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a69a2;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar38;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a681e;
LAB_018a69a2:
  if (4 < bVar44 - 9) {
    if ((bVar44 == 0x65) || (bVar44 == 0x45)) {
      if ((uVar40 != local_278) && (uVar40 + 1 < uVar34)) {
        _exponent = (pointer)((ulong)uStack_24e << 0x10);
        pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
        iVar39 = uVar26 + (size - uVar40);
        if (*pbVar42 == 0x2d) {
          bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             ((char *)pbVar42,iVar39,&exponent,bVar15);
        }
        else {
          bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             ((char *)pbVar42,iVar39,&exponent,bVar15);
        }
        if (bVar15 != false) {
          bVar15 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<short>,false>
                             ((IntegerDecimalCastData<short> *)&pos_1,exponent.result);
          goto joined_r0x018a6a95;
        }
      }
    }
    else if (bVar44 == 0x20) goto LAB_018a69b1;
    goto LAB_018a1933;
  }
LAB_018a69b1:
  uVar26 = uVar40 + 1;
  uVar40 = uVar26;
  if (uVar26 < uVar34) {
    uVar40 = uVar34;
  }
  for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
    if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
       ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
    goto LAB_018a1933;
  }
LAB_018a67cf:
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                     ((IntegerDecimalCastData<short> *)&pos_1);
LAB_018a67d9:
  bVar16 = local_278 < uVar40;
LAB_018a67e1:
  bVar15 = (bool)(bVar15 & bVar16);
  goto joined_r0x018a6a95;
LAB_018a0fb4:
  uVar40 = uVar34;
  if (uVar26 <= uVar40) goto joined_r0x018a32ec;
  bVar44 = ((byte *)value_ptr)[uVar49 + uVar40];
  if (9 < (byte)(bVar44 - 0x30)) {
    if (bVar44 == 0x2e) {
      if (uVar26 <= uVar40 + 1) goto joined_r0x018a32ec;
      if ((uVar40 < 2) ||
         (bVar44 = ((byte *)value_ptr)[uVar49 + 1 + uVar40], uVar40 = uVar40 + 1,
         (byte)(bVar44 - 0x30) < 10)) goto LAB_018a32f2;
    }
    if ((bVar44 < 0x21) && ((0x100003e00U >> ((ulong)bVar44 & 0x3f) & 1) != 0)) {
      uVar34 = uVar40 + 1;
      uVar40 = uVar34;
      if (uVar34 < uVar26) {
        uVar40 = uVar26;
      }
      goto LAB_018a32c9;
    }
    goto LAB_018a32f2;
  }
  bVar19 = (byte)(0xb0 - bVar44) / 10;
  if ((SBORROW1(bVar38,-bVar19) != (char)(bVar38 + bVar19) < '\0') ||
     (((bVar38 = (bVar38 * '\n' - bVar44) + 0x30, uVar34 = uVar26, ~uVar40 + size != uVar49 &&
       (uVar34 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
      (((size - uVar40) - 2 == uVar49 ||
       (uVar34 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))))
  goto LAB_018a32f2;
  goto LAB_018a0fb4;
LAB_018a32c9:
  if (uVar26 <= uVar34) goto joined_r0x018a32ec;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar34]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar34] & 0x3f) & 1) == 0))
  goto LAB_018a32f2;
  uVar34 = uVar34 + 1;
  goto LAB_018a32c9;
LAB_018a2fe3:
  if (uVar34 <= uVar40) goto joined_r0x018a32ec;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x30) {
    bVar44 = 0;
  }
  else {
    if (((byte *)value_ptr)[uVar49 + 1 + uVar40] != 0x31) goto LAB_018a32f2;
    bVar44 = 1;
  }
  uVar26 = uVar34;
  if ((size - uVar40) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar40] == 0x5f) {
      if (((size - uVar40) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar40] & 0xfe) != 0x30)) goto LAB_018a32f2;
      uVar26 = uVar40 + 2;
    }
    else {
      uVar26 = uVar40 + 1;
    }
  }
  uVar40 = uVar26;
  if ('?' < (char)bVar38) goto LAB_018a32f2;
  bVar38 = bVar44 | bVar38 * '\x02';
  goto LAB_018a2fe3;
LAB_018a1d82:
  if (uVar34 <= uVar40) goto joined_r0x018a32ec;
  bVar44 = ((byte *)value_ptr)[uVar49 + 1 + uVar40];
  bVar19 = bVar44 | 0x20;
  if (0x19 < (byte)(bVar44 + 0xbf)) {
    bVar19 = bVar44;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar19);
  if (!bVar15) goto LAB_018a32f2;
  cVar43 = -0x30;
  if ('`' < (char)bVar19) {
    cVar43 = -0x57;
  }
  uVar26 = uVar34;
  if ((size - uVar40) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar40] == 0x5f) {
      if (((size - uVar40) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar40]), !bVar15))
      goto LAB_018a32f2;
      uVar26 = uVar40 + 2;
    }
    else {
      uVar26 = uVar40 + 1;
    }
  }
  if ((char)(cVar43 + bVar19 ^ 0x7f) / '\x10' < (char)bVar38) goto LAB_018a32f2;
  bVar38 = cVar43 + bVar19 + bVar38 * '\x10';
  uVar40 = uVar26;
  goto LAB_018a1d82;
joined_r0x018a32ec:
  if (1 < uVar40) goto LAB_018a57e0;
  goto LAB_018a32f2;
LAB_018a24af:
  uVar50 = uVar26;
  if (uVar34 <= uVar50) goto LAB_018a2c1f;
  bVar44 = ((byte *)value_ptr)[uVar49 + uVar50];
  if (9 < (byte)(bVar44 - 0x30)) {
    if (bVar44 == 0x2e) {
      uVar26 = uVar50 + 1;
      if (uVar34 <= uVar26) {
        bVar15 = uVar40 < uVar50;
        uVar50 = uVar26;
        if (bVar15) goto LAB_018a2c1f;
        goto LAB_018a32f2;
      }
      if ((uVar50 <= uVar40) ||
         (bVar44 = ((byte *)value_ptr)[uVar49 + 1 + uVar50], uVar50 = uVar26,
         (byte)(bVar44 - 0x30) < 10)) goto LAB_018a32f2;
    }
    if ((bVar44 < 0x21) && ((0x100003e00U >> ((ulong)bVar44 & 0x3f) & 1) != 0)) {
      uVar26 = uVar50 + 1;
      uVar50 = uVar26;
      if (uVar26 < uVar34) {
        uVar50 = uVar34;
      }
      goto LAB_018a4241;
    }
    goto LAB_018a32f2;
  }
  if (((char)((byte)(0xaf - bVar44) / 10) < (char)bVar38) ||
     (((bVar38 = (bVar44 - 0x30) + bVar38 * '\n', uVar26 = uVar34, ~uVar50 + size != uVar49 &&
       (uVar26 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
      (((size - uVar50) - 2 == uVar49 ||
       (uVar26 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
  goto LAB_018a32f2;
  goto LAB_018a24af;
LAB_018a4241:
  if (uVar34 <= uVar26) goto LAB_018a2c1f;
  if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
     ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
  goto LAB_018a32f2;
  uVar26 = uVar26 + 1;
  goto LAB_018a4241;
LAB_018a2c1f:
  if (uVar40 < uVar50) {
LAB_018a57e0:
    *(byte *)((long)local_260 + local_258) = bVar38;
    goto LAB_018a1a7f;
  }
LAB_018a32f2:
  for (uVar49 = 0; uVar34 = size - uVar49, uVar34 != 0; uVar49 = uVar49 + 1) {
    bVar38 = ((byte *)value_ptr)[uVar49];
    if ((0x20 < (ulong)bVar38) || ((0x100003e00U >> ((ulong)bVar38 & 0x3f) & 1) == 0)) {
      local_218[0]._M_allocated_capacity = 0;
      pos_1._0_1_ = 0;
      pos_1._1_1_ = 0;
      uVar33 = pos_1._1_1_;
      pos_1._2_2_ = 0;
      uVar11 = pos_1._2_2_;
      pos_1._4_4_ = 0;
      uVar5 = pos_1._4_4_;
      uStack_220 = 0;
      uVar12 = uStack_220;
      uStack_21c = 0;
      uVar13 = uStack_21c;
      uVar26 = ~uVar49;
      bVar15 = SUB81(uVar34,0);
      if (bVar38 == 0x2d) {
        lVar41 = 0;
        uVar40 = 1;
        goto LAB_018a3354;
      }
      if (bVar38 == 0x30 && size - 1 != uVar49) {
        bVar44 = ((byte *)value_ptr)[uVar49 + 1];
        if (bVar44 == 0x42) {
LAB_018a44a3:
          lVar41 = 0;
          uVar34 = 1;
          goto LAB_018a44b0;
        }
        if (bVar44 != 0x78) {
          if (bVar44 == 0x62) goto LAB_018a44a3;
          if (bVar44 != 0x58) goto LAB_018a351e;
        }
        lVar41 = 0;
        uVar34 = 1;
        goto LAB_018a3439;
      }
LAB_018a351e:
      local_278 = (ulong)(bVar38 == 0x2b);
      lVar41 = 0;
      uVar40 = local_278;
      goto LAB_018a3533;
    }
  }
  goto LAB_018a1933;
  while( true ) {
    bVar38 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar44 = bVar38 - 0x30;
    if (9 < bVar44) {
      if (bVar38 != 0x2e) goto LAB_018a465c;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a3600;
    }
    uVar40 = (0x8000000000000000 - (ulong)bVar44) / 10;
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if ((SBORROW8(lVar41,-uVar40) != (long)(lVar41 + uVar40) < 0) ||
       (((lVar41 = lVar41 * 10 - (ulong)bVar44, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a3354:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a35d2;
  }
  goto LAB_018a1933;
LAB_018a3600:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a35d2;
    goto LAB_018a1933;
  }
  bVar38 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar44 = bVar38 - 0x30;
  if (9 < bVar44) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if (uVar29 < uVar40 || 1 < uVar50) goto LAB_018a465c;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar44 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar44;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a3600;
LAB_018a465c:
  uVar47 = (uint)bVar38;
  if (uVar47 - 9 < 5) {
LAB_018a466b:
    uVar26 = uVar40 + 1;
    uVar40 = uVar26;
    if (uVar26 < uVar34) {
      uVar40 = uVar34;
    }
    for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
      if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
         ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
      goto LAB_018a1933;
    }
LAB_018a35d2:
    bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,true>
                       ((IntegerDecimalCastData<signed_char> *)&pos_1);
LAB_018a5ba1:
    bVar16 = 1 < uVar40;
    goto LAB_018a5ba8;
  }
  if ((uVar47 == 0x65) || (uVar47 == 0x45)) {
    if ((uVar40 != 1) && (uVar40 + 1 < uVar34)) {
      _exponent = (pointer)((ulong)uStack_24e << 0x10);
      pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
      iVar39 = uVar26 + (size - uVar40);
      if (*pbVar42 == 0x2d) {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      else {
        bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                           ((char *)pbVar42,iVar39,&exponent,bVar15);
      }
      if (bVar15 != false) {
        bVar15 = IntegerDecimalCastOperation::
                 HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,true>
                           ((IntegerDecimalCastData<signed_char> *)&pos_1,exponent.result);
        goto joined_r0x018a6ae2;
      }
    }
  }
  else if (uVar47 == 0x20) goto LAB_018a466b;
  goto LAB_018a1933;
LAB_018a44b0:
  if (uVar26 + size <= uVar34) goto LAB_018a5168;
  if (((byte *)value_ptr)[uVar49 + 1 + uVar34] == 0x30) {
    uVar40 = 0;
  }
  else {
    uVar40 = 1;
    if (((byte *)value_ptr)[uVar49 + 1 + uVar34] != 0x31) goto LAB_018a1933;
  }
  uVar50 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         ((((byte *)value_ptr)[uVar49 + 3 + uVar34] & 0xfe) != 0x30)) goto LAB_018a1933;
      uVar50 = uVar34 + 2;
    }
    else {
      uVar50 = uVar34 + 1;
    }
  }
  uVar34 = uVar50;
  if (0x3fffffffffffffff < lVar41) goto LAB_018a1933;
  lVar41 = uVar40 + lVar41 * 2;
  goto LAB_018a44b0;
LAB_018a5168:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                     ((IntegerDecimalCastData<signed_char> *)&pos_1);
  goto LAB_018a6add;
LAB_018a3439:
  if (uVar26 + size <= uVar34) goto LAB_018a6ac7;
  bVar38 = ((byte *)value_ptr)[uVar49 + 1 + uVar34];
  bVar44 = bVar38 | 0x20;
  if (0x19 < (byte)(bVar38 + 0xbf)) {
    bVar44 = bVar38;
  }
  bVar15 = StringUtil::CharacterIsHex(bVar44);
  if (!bVar15) goto LAB_018a1933;
  cVar43 = -0x30;
  if ('`' < (char)bVar44) {
    cVar43 = -0x57;
  }
  uVar40 = uVar26 + size;
  if ((size - uVar34) - 2 != uVar49) {
    if (((byte *)value_ptr)[uVar49 + 2 + uVar34] == 0x5f) {
      if (((size - uVar34) - 3 == uVar49) ||
         (bVar15 = StringUtil::CharacterIsHex(((byte *)value_ptr)[uVar49 + 3 + uVar34]), !bVar15))
      goto LAB_018a1933;
      uVar40 = uVar34 + 2;
    }
    else {
      uVar40 = uVar34 + 1;
    }
  }
  if ((long)((ulong)((byte)(cVar43 + bVar44) >> 4) ^ 0x7ffffffffffffff) < lVar41) goto LAB_018a1933;
  lVar41 = lVar41 * 0x10 + (ulong)(byte)(cVar43 + bVar44);
  uVar34 = uVar40;
  goto LAB_018a3439;
LAB_018a6ac7:
  pos_1._0_1_ = (undefined1)lVar41;
  pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
  pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
  pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                     ((IntegerDecimalCastData<signed_char> *)&pos_1);
LAB_018a6add:
  bVar15 = (bool)(1 < uVar34 & bVar15);
joined_r0x018a6ae2:
  if (bVar15 != false) {
    *(undefined1 *)((long)local_260 + local_258) = (undefined1)pos_1;
    goto LAB_018a1a7f;
  }
  goto LAB_018a1933;
LAB_018a3f10:
  uVar40 = uVar31;
  uStack_220 = (undefined4)lVar41;
  uStack_21c = (undefined4)((ulong)lVar41 >> 0x20);
  if (uVar34 <= uVar40) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a3eb6;
    goto LAB_018a1933;
  }
  bVar44 = ((byte *)value_ptr)[uVar49 + uVar40];
  bVar38 = bVar44 - 0x30;
  if (9 < bVar38) {
    local_218[0]._2_6_ = 0;
    local_218[0]._0_2_ = uVar45;
    if ((local_278 < uVar50) || (uVar29 < uVar40)) goto LAB_018a4f38;
    goto LAB_018a1933;
  }
  uVar31 = ((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10;
  lVar48 = lVar41 * 10 + (ulong)bVar38;
  if ((long)uVar31 < lVar41) {
    lVar48 = lVar41;
  }
  uVar45 = uVar45 + (lVar41 <= (long)uVar31);
  uVar31 = uVar34;
  lVar41 = lVar48;
  if (((~uVar40 + size != uVar49) &&
      (uVar31 = uVar40 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar40] == 0x5f)) &&
     ((uStack_220 = uVar12, uStack_21c = uVar13, (size - uVar40) - 2 == uVar49 ||
      (uVar31 = uVar40 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar40] - 0x30)))))
  goto LAB_018a1933;
  goto LAB_018a3f10;
LAB_018a4f38:
  if (4 < bVar44 - 9) {
    if ((bVar44 == 0x65) || (bVar44 == 0x45)) {
      if ((uVar40 != local_278) && (uVar40 + 1 < uVar34)) {
        _exponent = (pointer)((ulong)uStack_24e << 0x10);
        pbVar42 = (byte *)value_ptr + uVar49 + uVar40 + 1;
        iVar39 = uVar26 + (size - uVar40);
        if (*pbVar42 == 0x2d) {
          bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             ((char *)pbVar42,iVar39,&exponent,bVar15);
        }
        else {
          bVar15 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             ((char *)pbVar42,iVar39,&exponent,bVar15);
        }
        if (bVar15 != false) {
          bVar15 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,false>
                             ((IntegerDecimalCastData<signed_char> *)&pos_1,exponent.result);
          goto joined_r0x018a6ae2;
        }
      }
    }
    else if (bVar44 == 0x20) goto LAB_018a4f47;
    goto LAB_018a1933;
  }
LAB_018a4f47:
  uVar26 = uVar40 + 1;
  uVar40 = uVar26;
  if (uVar26 < uVar34) {
    uVar40 = uVar34;
  }
  for (; uVar26 < uVar34; uVar26 = uVar26 + 1) {
    if ((0x20 < (ulong)((byte *)value_ptr)[uVar49 + uVar26]) ||
       ((0x100003e00U >> ((ulong)((byte *)value_ptr)[uVar49 + uVar26] & 0x3f) & 1) == 0))
    goto LAB_018a1933;
  }
LAB_018a3eb6:
  bVar15 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                     ((IntegerDecimalCastData<signed_char> *)&pos_1);
LAB_018a5ac3:
  bVar16 = local_278 < uVar40;
LAB_018a5ba8:
  bVar15 = (bool)(bVar15 & bVar16);
  goto joined_r0x018a6ae2;
  while( true ) {
    bVar44 = ((byte *)value_ptr)[uVar49 + uVar50];
    bVar38 = bVar44 - 0x30;
    if (9 < bVar38) {
      if (bVar44 != 0x2e) goto LAB_018a4f38;
      uVar29 = uVar50 + 1;
      uVar45 = 0;
      uVar31 = uVar29;
      lVar41 = 0;
      goto LAB_018a3f10;
    }
    pos_1._1_1_ = uVar33;
    pos_1._2_2_ = uVar11;
    pos_1._4_4_ = uVar5;
    if (((long)(((ulong)bVar38 ^ 0x7ffffffffffffffe) / 10) < lVar41) ||
       (((lVar41 = lVar41 * 10 + (ulong)bVar38, uVar40 = uVar34, ~uVar50 + size != uVar49 &&
         (uVar40 = uVar50 + 1, ((byte *)value_ptr)[uVar49 + 1 + uVar50] == 0x5f)) &&
        (((size - uVar50) - 2 == uVar49 ||
         (uVar40 = uVar50 + 2, 9 < (byte)(((byte *)value_ptr)[uVar49 + 2 + uVar50] - 0x30)))))))
    break;
LAB_018a3533:
    uVar50 = uVar40;
    pos_1._2_2_ = (undefined2)((ulong)lVar41 >> 0x10);
    pos_1._0_1_ = (undefined1)lVar41;
    pos_1._1_1_ = (undefined1)((ulong)lVar41 >> 8);
    pos_1._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
    uVar40 = uVar50;
    if (uVar34 <= uVar50) goto LAB_018a3eb6;
  }
LAB_018a1933:
  pos_1._0_1_ = 0;
  LineError::Insert(&this->current_errors,(CSVErrorType *)&pos_1,local_230,local_a8,
                    &(this->super_ScannerResult).last_position,0);
  bVar15 = CSVReaderOptions::IgnoreErrors(((this->super_ScannerResult).state_machine)->options);
  if (!bVar15) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&pos_1);
    poVar28 = ::std::operator<<((ostream *)&pos_1,"Could not convert string \"");
    _exponent = local_240;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&exponent,value_ptr,(byte *)value_ptr + size);
    poVar28 = ::std::operator<<(poVar28,(string *)&exponent);
    poVar28 = ::std::operator<<(poVar28,"\" to \'");
    LogicalTypeIdToString_abi_cxx11_
              ((string *)&simple_data,
               (duckdb *)
               (ulong)*(LogicalTypeId *)
                       ((long)((this->parse_types).
                               super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl +
                              this->chunk_col_id) + 1),type);
    poVar28 = ::std::operator<<(poVar28,(string *)&simple_data);
    ::std::operator<<(poVar28,"\'");
    ::std::__cxx11::string::~string((string *)&simple_data);
    ::std::__cxx11::string::~string((string *)&exponent);
    ::std::__cxx11::stringbuf::str();
    FullLinePosition::SanitizeError((string *)&exponent);
    ::std::__cxx11::string::string((string *)&local_70,(string *)&exponent);
    LineError::ModifyErrorMessageOfLastError(&this->current_errors,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&exponent);
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pos_1);
  }
LAB_018a1a7f:
  *local_230 = *local_230 + 1;
  *local_a8 = *local_a8 + 1;
  ::std::__cxx11::string::~string((string *)&strip_thousands);
  return;
}

Assistant:

void StringValueResult::AddValueToVector(const char *value_ptr, idx_t size, bool allocate) {
	if (HandleTooManyColumnsError(value_ptr, size)) {
		return;
	}
	if (cur_col_id >= number_of_columns) {
		if (!state_machine.state_machine_options.strict_mode.GetValue()) {
			return;
		}
		bool error = true;
		if (cur_col_id == number_of_columns && ((quoted && state_machine.options.allow_quoted_nulls) || !quoted)) {
			// we make an exception if the first over-value is null
			bool is_value_null = false;
			for (idx_t i = 0; i < null_str_count; i++) {
				is_value_null = is_value_null || IsValueNull(null_str_ptr[i], value_ptr, size);
			}
			error = !is_value_null;
		}
		if (error) {
			// We error pointing to the current value error.
			current_errors.Insert(TOO_MANY_COLUMNS, cur_col_id, chunk_col_id, last_position);
			cur_col_id++;
		}
		return;
	}

	if (projecting_columns) {
		if (!projected_columns[cur_col_id]) {
			cur_col_id++;
			return;
		}
	}

	if (((quoted && state_machine.options.allow_quoted_nulls) || !quoted)) {
		// Check for the occurrence of escaped null string like \N only if strict_mode is disabled
		const bool check_unquoted_escaped_null =
		    state_machine.state_machine_options.strict_mode.GetValue() == false && escaped && !quoted && size == 1;
		for (idx_t i = 0; i < null_str_count; i++) {
			bool is_null = false;
			if (null_str_size[i] == 2 && null_str_ptr[i][0] == state_machine.state_machine_options.escape.GetValue()) {
				is_null = check_unquoted_escaped_null && null_str_ptr[i][1] == value_ptr[0];
			} else if (size == null_str_size[i] && !check_unquoted_escaped_null) {
				is_null = IsValueNull(null_str_ptr[i], value_ptr, size);
			}
			if (is_null) {
				bool empty = false;
				if (chunk_col_id < state_machine.options.force_not_null.size()) {
					empty = state_machine.options.force_not_null[chunk_col_id];
				}
				if (empty) {
					if (parse_types[chunk_col_id].type_id != LogicalTypeId::VARCHAR) {
						// If it is not a varchar, empty values are not accepted, we must error.
						current_errors.Insert(CAST_ERROR, cur_col_id, chunk_col_id, last_position);
					} else {
						static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = string_t();
					}
				} else {
					if (chunk_col_id == number_of_columns) {
						// We check for a weird case, where we ignore an extra value, if it is a null value
						return;
					}
					validity_mask[chunk_col_id]->SetInvalid(static_cast<idx_t>(number_of_rows));
				}
				cur_col_id++;
				chunk_col_id++;
				return;
			}
		}
	}
	bool success = true;
	string strip_thousands;
	if (LogicalType::IsNumeric(parse_types[chunk_col_id].type_id) &&
	    state_machine.options.thousands_separator != '\0') {
		// If we have a thousands separator we should try to use that
		strip_thousands = BaseScanner::RemoveSeparator(value_ptr, size, state_machine.options.thousands_separator);
		value_ptr = strip_thousands.c_str();
		size = strip_thousands.size();
	}
	switch (parse_types[chunk_col_id].type_id) {
	case LogicalTypeId::BOOLEAN:
		success =
		    TryCastStringBool(value_ptr, size, static_cast<bool *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::TINYINT:
		success = TrySimpleIntegerCast(value_ptr, size, static_cast<int8_t *>(vector_ptr[chunk_col_id])[number_of_rows],
		                               false);
		break;
	case LogicalTypeId::SMALLINT:
		success = TrySimpleIntegerCast(value_ptr, size,
		                               static_cast<int16_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::INTEGER:
		success = TrySimpleIntegerCast(value_ptr, size,
		                               static_cast<int32_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::BIGINT:
		success = TrySimpleIntegerCast(value_ptr, size,
		                               static_cast<int64_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::UTINYINT:
		success = TrySimpleIntegerCast<uint8_t, false>(
		    value_ptr, size, static_cast<uint8_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::USMALLINT:
		success = TrySimpleIntegerCast<uint16_t, false>(
		    value_ptr, size, static_cast<uint16_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::UINTEGER:
		success = TrySimpleIntegerCast<uint32_t, false>(
		    value_ptr, size, static_cast<uint32_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::UBIGINT:
		success = TrySimpleIntegerCast<uint64_t, false>(
		    value_ptr, size, static_cast<uint64_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::DOUBLE:
		success =
		    TryDoubleCast<double>(value_ptr, size, static_cast<double *>(vector_ptr[chunk_col_id])[number_of_rows],
		                          false, state_machine.options.decimal_separator[0]);
		break;
	case LogicalTypeId::FLOAT:
		success = TryDoubleCast<float>(value_ptr, size, static_cast<float *>(vector_ptr[chunk_col_id])[number_of_rows],
		                               false, state_machine.options.decimal_separator[0]);
		break;
	case LogicalTypeId::DATE: {
		if (!date_format.Empty()) {
			success = date_format.TryParseDate(value_ptr, size,
			                                   static_cast<date_t *>(vector_ptr[chunk_col_id])[number_of_rows]);
		} else {
			idx_t pos;
			bool special;
			success = Date::TryConvertDate(value_ptr, size, pos,
			                               static_cast<date_t *>(vector_ptr[chunk_col_id])[number_of_rows], special,
			                               false) == DateCastResult::SUCCESS;
		}
		break;
	}
	case LogicalTypeId::TIME: {
		idx_t pos;
		success = Time::TryConvertTime(value_ptr, size, pos,
		                               static_cast<dtime_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	}
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ: {
		if (!timestamp_format.Empty()) {
			success = timestamp_format.TryParseTimestamp(
			    value_ptr, size, static_cast<timestamp_t *>(vector_ptr[chunk_col_id])[number_of_rows]);
		} else {
			success = Timestamp::TryConvertTimestamp(
			              value_ptr, size, static_cast<timestamp_t *>(vector_ptr[chunk_col_id])[number_of_rows]) ==
			          TimestampCastResult::SUCCESS;
		}
		break;
	}
	case LogicalTypeId::DECIMAL: {
		if (decimal_separator == ',') {
			switch (parse_types[chunk_col_id].internal_type) {
			case PhysicalType::INT16:
				success = TryDecimalStringCast<int16_t, ','>(
				    value_ptr, size, static_cast<int16_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT32:
				success = TryDecimalStringCast<int32_t, ','>(
				    value_ptr, size, static_cast<int32_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT64:
				success = TryDecimalStringCast<int64_t, ','>(
				    value_ptr, size, static_cast<int64_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT128:
				success = TryDecimalStringCast<hugeint_t, ','>(
				    value_ptr, size, static_cast<hugeint_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(parse_types[chunk_col_id].internal_type));
			}

		} else if (decimal_separator == '.') {
			switch (parse_types[chunk_col_id].internal_type) {
			case PhysicalType::INT16:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<int16_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT32:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<int32_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT64:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<int64_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT128:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<hugeint_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(parse_types[chunk_col_id].internal_type));
			}
		} else {
			throw InvalidInputException("Decimals can only have ',' and '.' as decimal separators");
		}
		break;
	}
	default: {
		// By default, we add a string
		// We only evaluate if a string is utf8 valid, if it's actually a varchar
		if (parse_types[chunk_col_id].validate_utf8 &&
		    !Utf8Proc::IsValid(value_ptr, UnsafeNumericCast<uint32_t>(size))) {
			bool force_error = !state_machine.options.ignore_errors.GetValue() && sniffing;
			// Invalid unicode, we must error
			if (force_error) {
				HandleUnicodeError(cur_col_id, last_position);
			}
			// If we got here, we are ignoring errors, hence we must ignore this line.
			current_errors.Insert(INVALID_ENCODING, cur_col_id, chunk_col_id, last_position);
			static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = StringVector::AddStringOrBlob(
			    parse_chunk.data[chunk_col_id], string_t(value_ptr, UnsafeNumericCast<uint32_t>(0)));
			break;
		}
		if (allocate) {
			// If it's a value produced over multiple buffers, we must allocate
			static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = StringVector::AddStringOrBlob(
			    parse_chunk.data[chunk_col_id], string_t(value_ptr, UnsafeNumericCast<uint32_t>(size)));
		} else {
			static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] =
			    string_t(value_ptr, UnsafeNumericCast<uint32_t>(size));
		}
		break;
	}
	}
	if (!success) {
		current_errors.Insert(CAST_ERROR, cur_col_id, chunk_col_id, last_position);
		if (!state_machine.options.IgnoreErrors()) {
			// We have to write the cast error message.
			std::ostringstream error;
			// Casting Error Message
			error << "Could not convert string \"" << std::string(value_ptr, size) << "\" to \'"
			      << LogicalTypeIdToString(parse_types[chunk_col_id].type_id) << "\'";
			auto error_string = error.str();
			FullLinePosition::SanitizeError(error_string);

			current_errors.ModifyErrorMessageOfLastError(error_string);
		}
	}
	cur_col_id++;
	chunk_col_id++;
}